

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  float *pfVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined3 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  bool bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined6 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  byte bVar38;
  ulong uVar39;
  ulong uVar40;
  RTCFilterFunctionN p_Var41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  Ray *pRVar46;
  bool bVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  short sVar53;
  float t1;
  float fVar54;
  undefined2 uVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar86;
  float fVar100;
  float fVar101;
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  float fVar119;
  float fVar120;
  vfloat4 v;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar134;
  float fVar135;
  vfloat4 v_1;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar141;
  float fVar142;
  vfloat4 a;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar143;
  float fVar151;
  float fVar152;
  vfloat_impl<4> p00;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar169;
  float fVar170;
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar189;
  float fVar190;
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar204;
  float fVar205;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar213;
  float fVar214;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar216;
  float fVar221;
  float fVar223;
  vfloat4 a_1;
  float fVar222;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar226;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar235;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar236 [16];
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar246;
  float fVar250;
  float fVar251;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_42d;
  uint local_42c;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined4 local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  ulong local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  ulong local_2e8;
  ulong local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  uint auStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 uVar82;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar132 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  
  PVar3 = prim[1];
  uVar39 = (ulong)(byte)PVar3;
  pPVar1 = prim + uVar39 * 0x19 + 6;
  fVar120 = *(float *)(pPVar1 + 0xc);
  fVar121 = ((ray->org).field_0.m128[0] - *(float *)pPVar1) * fVar120;
  fVar134 = ((ray->org).field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar120;
  fVar135 = ((ray->org).field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar120;
  fVar102 = fVar120 * (ray->dir).field_0.m128[0];
  fVar119 = fVar120 * (ray->dir).field_0.m128[1];
  fVar120 = fVar120 * (ray->dir).field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar39 * 4 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar44;
  auVar95._12_2_ = uVar83;
  auVar95._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar194._12_4_ = auVar95._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar44;
  auVar194._10_2_ = uVar83;
  auVar62._10_6_ = auVar194._10_6_;
  auVar62._8_2_ = uVar83;
  auVar62._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar23._4_8_ = auVar62._8_8_;
  auVar23._2_2_ = uVar83;
  auVar23._0_2_ = uVar83;
  fVar86 = (float)((int)sVar53 >> 8);
  fVar100 = (float)(auVar23._0_4_ >> 0x18);
  fVar101 = (float)(auVar62._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 * 5 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar44;
  auVar55._12_2_ = uVar83;
  auVar55._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar253._12_4_ = auVar55._12_4_;
  auVar253._8_2_ = 0;
  auVar253._0_8_ = uVar44;
  auVar253._10_2_ = uVar83;
  auVar106._10_6_ = auVar253._10_6_;
  auVar106._8_2_ = uVar83;
  auVar106._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar24._4_8_ = auVar106._8_8_;
  auVar24._2_2_ = uVar83;
  auVar24._0_2_ = uVar83;
  fVar136 = (float)((int)sVar53 >> 8);
  fVar141 = (float)(auVar24._0_4_ >> 0x18);
  fVar142 = (float)(auVar106._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 * 6 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar44;
  auVar58._12_2_ = uVar83;
  auVar58._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar44;
  auVar57._10_2_ = uVar83;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar83;
  auVar56._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar25._4_8_ = auVar56._8_8_;
  auVar25._2_2_ = uVar83;
  auVar25._0_2_ = uVar83;
  fVar143 = (float)((int)sVar53 >> 8);
  fVar151 = (float)(auVar25._0_4_ >> 0x18);
  fVar152 = (float)(auVar56._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 * 0xb + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar44;
  auVar61._12_2_ = uVar83;
  auVar61._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar44;
  auVar60._10_2_ = uVar83;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar83;
  auVar59._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar26._4_8_ = auVar59._8_8_;
  auVar26._2_2_ = uVar83;
  auVar26._0_2_ = uVar83;
  fVar54 = (float)((int)sVar53 >> 8);
  fVar84 = (float)(auVar26._0_4_ >> 0x18);
  fVar85 = (float)(auVar59._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar156._8_4_ = 0;
  auVar156._0_8_ = uVar44;
  auVar156._12_2_ = uVar83;
  auVar156._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._8_2_ = 0;
  auVar155._0_8_ = uVar44;
  auVar155._10_2_ = uVar83;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._8_2_ = uVar83;
  auVar154._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar27._4_8_ = auVar154._8_8_;
  auVar27._2_2_ = uVar83;
  auVar27._0_2_ = uVar83;
  fVar153 = (float)((int)sVar53 >> 8);
  fVar169 = (float)(auVar27._0_4_ >> 0x18);
  fVar170 = (float)(auVar154._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (uint)(byte)PVar3 * 0xc + uVar39 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar44;
  auVar174._12_2_ = uVar83;
  auVar174._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar44;
  auVar173._10_2_ = uVar83;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar83;
  auVar172._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar28._4_8_ = auVar172._8_8_;
  auVar28._2_2_ = uVar83;
  auVar28._0_2_ = uVar83;
  fVar206 = (float)((int)sVar53 >> 8);
  fVar213 = (float)(auVar28._0_4_ >> 0x18);
  fVar214 = (float)(auVar172._8_4_ >> 0x18);
  uVar45 = (ulong)(uint)((int)(uVar39 * 9) * 2);
  uVar4 = *(undefined4 *)(prim + uVar45 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar44;
  auVar177._12_2_ = uVar83;
  auVar177._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar44;
  auVar176._10_2_ = uVar83;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar83;
  auVar175._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar29._4_8_ = auVar175._8_8_;
  auVar29._2_2_ = uVar83;
  auVar29._0_2_ = uVar83;
  fVar191 = (float)((int)sVar53 >> 8);
  fVar204 = (float)(auVar29._0_4_ >> 0x18);
  fVar205 = (float)(auVar175._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar45 + uVar39 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar44;
  auVar180._12_2_ = uVar83;
  auVar180._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar44;
  auVar179._10_2_ = uVar83;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar83;
  auVar178._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar30._4_8_ = auVar178._8_8_;
  auVar30._2_2_ = uVar83;
  auVar30._0_2_ = uVar83;
  fVar215 = (float)((int)sVar53 >> 8);
  fVar221 = (float)(auVar30._0_4_ >> 0x18);
  fVar223 = (float)(auVar178._8_4_ >> 0x18);
  uVar40 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  uVar4 = *(undefined4 *)(prim + uVar40 + 6);
  uVar82 = (undefined1)((uint)uVar4 >> 0x18);
  uVar83 = CONCAT11(uVar82,uVar82);
  uVar82 = (undefined1)((uint)uVar4 >> 0x10);
  uVar20 = CONCAT35(CONCAT21(uVar83,uVar82),CONCAT14(uVar82,uVar4));
  uVar82 = (undefined1)((uint)uVar4 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar20 >> 0x20),uVar82),uVar82);
  sVar53 = CONCAT11((char)uVar4,(char)uVar4);
  uVar44 = CONCAT62(uVar22,sVar53);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar44;
  auVar183._12_2_ = uVar83;
  auVar183._14_2_ = uVar83;
  uVar83 = (undefined2)((ulong)uVar20 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar44;
  auVar182._10_2_ = uVar83;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar83;
  auVar181._0_8_ = uVar44;
  uVar83 = (undefined2)uVar22;
  auVar31._4_8_ = auVar181._8_8_;
  auVar31._2_2_ = uVar83;
  auVar31._0_2_ = uVar83;
  fVar246 = (float)((int)sVar53 >> 8);
  fVar250 = (float)(auVar31._0_4_ >> 0x18);
  fVar251 = (float)(auVar181._8_4_ >> 0x18);
  fVar234 = fVar102 * fVar86 + fVar119 * fVar136 + fVar120 * fVar143;
  fVar240 = fVar102 * fVar100 + fVar119 * fVar141 + fVar120 * fVar151;
  fVar242 = fVar102 * fVar101 + fVar119 * fVar142 + fVar120 * fVar152;
  fVar244 = fVar102 * (float)(auVar194._12_4_ >> 0x18) +
            fVar119 * (float)(auVar253._12_4_ >> 0x18) + fVar120 * (float)(auVar57._12_4_ >> 0x18);
  fVar226 = fVar102 * fVar54 + fVar119 * fVar153 + fVar120 * fVar206;
  fVar231 = fVar102 * fVar84 + fVar119 * fVar169 + fVar120 * fVar213;
  fVar232 = fVar102 * fVar85 + fVar119 * fVar170 + fVar120 * fVar214;
  fVar233 = fVar102 * (float)(auVar60._12_4_ >> 0x18) +
            fVar119 * (float)(auVar155._12_4_ >> 0x18) + fVar120 * (float)(auVar173._12_4_ >> 0x18);
  fVar171 = fVar102 * fVar191 + fVar119 * fVar215 + fVar120 * fVar246;
  fVar189 = fVar102 * fVar204 + fVar119 * fVar221 + fVar120 * fVar250;
  fVar190 = fVar102 * fVar205 + fVar119 * fVar223 + fVar120 * fVar251;
  fVar102 = fVar102 * (float)(auVar176._12_4_ >> 0x18) +
            fVar119 * (float)(auVar179._12_4_ >> 0x18) + fVar120 * (float)(auVar182._12_4_ >> 0x18);
  fVar136 = fVar86 * fVar121 + fVar136 * fVar134 + fVar143 * fVar135;
  fVar141 = fVar100 * fVar121 + fVar141 * fVar134 + fVar151 * fVar135;
  fVar142 = fVar101 * fVar121 + fVar142 * fVar134 + fVar152 * fVar135;
  fVar143 = (float)(auVar194._12_4_ >> 0x18) * fVar121 +
            (float)(auVar253._12_4_ >> 0x18) * fVar134 + (float)(auVar57._12_4_ >> 0x18) * fVar135;
  fVar206 = fVar54 * fVar121 + fVar153 * fVar134 + fVar206 * fVar135;
  fVar213 = fVar84 * fVar121 + fVar169 * fVar134 + fVar213 * fVar135;
  fVar170 = fVar85 * fVar121 + fVar170 * fVar134 + fVar214 * fVar135;
  fVar214 = (float)(auVar60._12_4_ >> 0x18) * fVar121 +
            (float)(auVar155._12_4_ >> 0x18) * fVar134 + (float)(auVar173._12_4_ >> 0x18) * fVar135;
  fVar151 = fVar121 * fVar191 + fVar134 * fVar215 + fVar135 * fVar246;
  fVar152 = fVar121 * fVar204 + fVar134 * fVar221 + fVar135 * fVar250;
  fVar153 = fVar121 * fVar205 + fVar134 * fVar223 + fVar135 * fVar251;
  fVar169 = fVar121 * (float)(auVar176._12_4_ >> 0x18) +
            fVar134 * (float)(auVar179._12_4_ >> 0x18) + fVar135 * (float)(auVar182._12_4_ >> 0x18);
  fVar120 = (float)DAT_01ff1d40;
  fVar54 = DAT_01ff1d40._4_4_;
  fVar84 = DAT_01ff1d40._8_4_;
  fVar85 = DAT_01ff1d40._12_4_;
  uVar48 = -(uint)(fVar120 <= ABS(fVar234));
  uVar49 = -(uint)(fVar54 <= ABS(fVar240));
  uVar51 = -(uint)(fVar84 <= ABS(fVar242));
  uVar52 = -(uint)(fVar85 <= ABS(fVar244));
  auVar236._0_4_ = (uint)fVar234 & uVar48;
  auVar236._4_4_ = (uint)fVar240 & uVar49;
  auVar236._8_4_ = (uint)fVar242 & uVar51;
  auVar236._12_4_ = (uint)fVar244 & uVar52;
  auVar122._0_4_ = ~uVar48 & (uint)fVar120;
  auVar122._4_4_ = ~uVar49 & (uint)fVar54;
  auVar122._8_4_ = ~uVar51 & (uint)fVar84;
  auVar122._12_4_ = ~uVar52 & (uint)fVar85;
  auVar122 = auVar122 | auVar236;
  uVar48 = -(uint)(fVar120 <= ABS(fVar226));
  uVar49 = -(uint)(fVar54 <= ABS(fVar231));
  uVar51 = -(uint)(fVar84 <= ABS(fVar232));
  uVar52 = -(uint)(fVar85 <= ABS(fVar233));
  auVar227._0_4_ = (uint)fVar226 & uVar48;
  auVar227._4_4_ = (uint)fVar231 & uVar49;
  auVar227._8_4_ = (uint)fVar232 & uVar51;
  auVar227._12_4_ = (uint)fVar233 & uVar52;
  auVar137._0_4_ = ~uVar48 & (uint)fVar120;
  auVar137._4_4_ = ~uVar49 & (uint)fVar54;
  auVar137._8_4_ = ~uVar51 & (uint)fVar84;
  auVar137._12_4_ = ~uVar52 & (uint)fVar85;
  auVar137 = auVar137 | auVar227;
  uVar48 = -(uint)(fVar120 <= ABS(fVar171));
  uVar49 = -(uint)(fVar54 <= ABS(fVar189));
  uVar51 = -(uint)(fVar84 <= ABS(fVar190));
  uVar52 = -(uint)(fVar85 <= ABS(fVar102));
  auVar184._0_4_ = (uint)fVar171 & uVar48;
  auVar184._4_4_ = (uint)fVar189 & uVar49;
  auVar184._8_4_ = (uint)fVar190 & uVar51;
  auVar184._12_4_ = (uint)fVar102 & uVar52;
  auVar192._0_4_ = ~uVar48 & (uint)fVar120;
  auVar192._4_4_ = ~uVar49 & (uint)fVar54;
  auVar192._8_4_ = ~uVar51 & (uint)fVar84;
  auVar192._12_4_ = ~uVar52 & (uint)fVar85;
  auVar192 = auVar192 | auVar184;
  auVar62 = rcpps(_DAT_01ff1d40,auVar122);
  fVar120 = auVar62._0_4_;
  fVar85 = auVar62._4_4_;
  fVar101 = auVar62._8_4_;
  fVar121 = auVar62._12_4_;
  fVar120 = (1.0 - auVar122._0_4_ * fVar120) * fVar120 + fVar120;
  fVar85 = (1.0 - auVar122._4_4_ * fVar85) * fVar85 + fVar85;
  fVar101 = (1.0 - auVar122._8_4_ * fVar101) * fVar101 + fVar101;
  fVar121 = (1.0 - auVar122._12_4_ * fVar121) * fVar121 + fVar121;
  auVar62 = rcpps(auVar62,auVar137);
  fVar54 = auVar62._0_4_;
  fVar86 = auVar62._4_4_;
  fVar102 = auVar62._8_4_;
  fVar134 = auVar62._12_4_;
  fVar54 = (1.0 - auVar137._0_4_ * fVar54) * fVar54 + fVar54;
  fVar86 = (1.0 - auVar137._4_4_ * fVar86) * fVar86 + fVar86;
  fVar102 = (1.0 - auVar137._8_4_ * fVar102) * fVar102 + fVar102;
  fVar134 = (1.0 - auVar137._12_4_ * fVar134) * fVar134 + fVar134;
  auVar62 = rcpps(auVar62,auVar192);
  fVar84 = auVar62._0_4_;
  fVar100 = auVar62._4_4_;
  fVar119 = auVar62._8_4_;
  fVar135 = auVar62._12_4_;
  fVar84 = (1.0 - auVar192._0_4_ * fVar84) * fVar84 + fVar84;
  fVar100 = (1.0 - auVar192._4_4_ * fVar100) * fVar100 + fVar100;
  fVar119 = (1.0 - auVar192._8_4_ * fVar119) * fVar119 + fVar119;
  fVar135 = (1.0 - auVar192._12_4_ * fVar135) * fVar135 + fVar135;
  uVar44 = *(ulong *)(prim + uVar39 * 7 + 6);
  uVar83 = (undefined2)(uVar44 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar44;
  auVar65._12_2_ = uVar83;
  auVar65._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar44 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar44;
  auVar64._10_2_ = uVar83;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar83;
  auVar63._0_8_ = uVar44;
  uVar83 = (undefined2)(uVar44 >> 0x10);
  auVar32._4_8_ = auVar63._8_8_;
  auVar32._2_2_ = uVar83;
  auVar32._0_2_ = uVar83;
  auVar123._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar141) * fVar85,
                ((float)(int)(short)uVar44 - fVar136) * fVar120);
  auVar123._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar142) * fVar101;
  auVar123._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar143) * fVar121;
  uVar44 = *(ulong *)(prim + uVar39 * 9 + 6);
  uVar83 = (undefined2)(uVar44 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar44;
  auVar68._12_2_ = uVar83;
  auVar68._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar44 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar44;
  auVar67._10_2_ = uVar83;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar83;
  auVar66._0_8_ = uVar44;
  uVar83 = (undefined2)(uVar44 >> 0x10);
  auVar33._4_8_ = auVar66._8_8_;
  auVar33._2_2_ = uVar83;
  auVar33._0_2_ = uVar83;
  auVar138._0_4_ = ((float)(int)(short)uVar44 - fVar136) * fVar120;
  auVar138._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar141) * fVar85;
  auVar138._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar142) * fVar101;
  auVar138._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar143) * fVar121;
  uVar44 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar39 * -2 + 6);
  uVar83 = (undefined2)(uVar45 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar45;
  auVar89._12_2_ = uVar83;
  auVar89._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar45 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar45;
  auVar88._10_2_ = uVar83;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar83;
  auVar87._0_8_ = uVar45;
  uVar83 = (undefined2)(uVar45 >> 0x10);
  auVar34._4_8_ = auVar87._8_8_;
  auVar34._2_2_ = uVar83;
  auVar34._0_2_ = uVar83;
  auVar90._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar213) * fVar86,
                ((float)(int)(short)uVar45 - fVar206) * fVar54);
  auVar90._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar170) * fVar102;
  auVar90._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar214) * fVar134;
  uVar83 = (undefined2)(uVar44 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar44;
  auVar71._12_2_ = uVar83;
  auVar71._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar44 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar44;
  auVar70._10_2_ = uVar83;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar83;
  auVar69._0_8_ = uVar44;
  uVar83 = (undefined2)(uVar44 >> 0x10);
  auVar35._4_8_ = auVar69._8_8_;
  auVar35._2_2_ = uVar83;
  auVar35._0_2_ = uVar83;
  auVar185._0_4_ = ((float)(int)(short)uVar44 - fVar206) * fVar54;
  auVar185._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar213) * fVar86;
  auVar185._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar170) * fVar102;
  auVar185._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar214) * fVar134;
  uVar44 = *(ulong *)(prim + uVar40 + uVar39 + 6);
  uVar83 = (undefined2)(uVar44 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar44;
  auVar74._12_2_ = uVar83;
  auVar74._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar44 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar44;
  auVar73._10_2_ = uVar83;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar83;
  auVar72._0_8_ = uVar44;
  uVar83 = (undefined2)(uVar44 >> 0x10);
  auVar36._4_8_ = auVar72._8_8_;
  auVar36._2_2_ = uVar83;
  auVar36._0_2_ = uVar83;
  auVar75._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar152) * fVar100,
                ((float)(int)(short)uVar44 - fVar151) * fVar84);
  auVar75._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar153) * fVar119;
  auVar75._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar169) * fVar135;
  uVar44 = *(ulong *)(prim + uVar39 * 0x17 + 6);
  uVar83 = (undefined2)(uVar44 >> 0x30);
  auVar159._8_4_ = 0;
  auVar159._0_8_ = uVar44;
  auVar159._12_2_ = uVar83;
  auVar159._14_2_ = uVar83;
  uVar83 = (undefined2)(uVar44 >> 0x20);
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._8_2_ = 0;
  auVar158._0_8_ = uVar44;
  auVar158._10_2_ = uVar83;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._8_2_ = uVar83;
  auVar157._0_8_ = uVar44;
  uVar83 = (undefined2)(uVar44 >> 0x10);
  auVar37._4_8_ = auVar157._8_8_;
  auVar37._2_2_ = uVar83;
  auVar37._0_2_ = uVar83;
  auVar160._0_4_ = ((float)(int)(short)uVar44 - fVar151) * fVar84;
  auVar160._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar152) * fVar100;
  auVar160._8_4_ = ((float)(auVar157._8_4_ >> 0x10) - fVar153) * fVar119;
  auVar160._12_4_ = ((float)(auVar158._12_4_ >> 0x10) - fVar169) * fVar135;
  auVar193._8_4_ = auVar123._8_4_;
  auVar193._0_8_ = auVar123._0_8_;
  auVar193._12_4_ = auVar123._12_4_;
  auVar194 = minps(auVar193,auVar138);
  auVar103._8_4_ = auVar90._8_4_;
  auVar103._0_8_ = auVar90._0_8_;
  auVar103._12_4_ = auVar90._12_4_;
  auVar62 = minps(auVar103,auVar185);
  auVar194 = maxps(auVar194,auVar62);
  auVar104._8_4_ = auVar75._8_4_;
  auVar104._0_8_ = auVar75._0_8_;
  auVar104._12_4_ = auVar75._12_4_;
  auVar62 = minps(auVar104,auVar160);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar144._4_4_ = uVar4;
  auVar144._0_4_ = uVar4;
  auVar144._8_4_ = uVar4;
  auVar144._12_4_ = uVar4;
  auVar62 = maxps(auVar62,auVar144);
  auVar62 = maxps(auVar194,auVar62);
  local_168 = auVar62._0_4_ * 0.99999964;
  fStack_164 = auVar62._4_4_ * 0.99999964;
  fStack_160 = auVar62._8_4_ * 0.99999964;
  fStack_15c = auVar62._12_4_ * 0.99999964;
  auVar194 = maxps(auVar123,auVar138);
  auVar62 = maxps(auVar90,auVar185);
  auVar194 = minps(auVar194,auVar62);
  auVar62 = maxps(auVar75,auVar160);
  fVar120 = ray->tfar;
  auVar91._4_4_ = fVar120;
  auVar91._0_4_ = fVar120;
  auVar91._8_4_ = fVar120;
  auVar91._12_4_ = fVar120;
  auVar62 = minps(auVar62,auVar91);
  auVar62 = minps(auVar194,auVar62);
  auVar92._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_168 <= auVar62._0_4_ * 1.0000004);
  auVar92._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_164 <= auVar62._4_4_ * 1.0000004);
  auVar92._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_160 <= auVar62._8_4_ * 1.0000004);
  auVar92._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_15c <= auVar62._12_4_ * 1.0000004);
  uVar48 = movmskps((uint)(byte)PVar3,auVar92);
  local_42d = uVar48 != 0;
  if (uVar48 == 0) {
    return local_42d;
  }
  uVar48 = uVar48 & 0xff;
  local_158._0_12_ = mm_lookupmask_ps._240_12_;
  local_158._12_4_ = 0;
  local_418 = ray;
LAB_00b6dba3:
  local_2e0 = (ulong)uVar48;
  lVar9 = 0;
  if (local_2e0 != 0) {
    for (; (uVar48 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  local_3c0 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  uVar44 = *(ulong *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  local_2e8 = (ulong)*(uint *)(prim + lVar9 * 4 + 6);
  uVar45 = (ulong)*(uint *)(uVar44 + _Var6 * *(uint *)(prim + lVar9 * 4 + 6));
  p_Var41 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var8 + uVar45 * (long)pvVar7);
  fVar120 = *pfVar2;
  fVar54 = pfVar2[1];
  fVar84 = pfVar2[2];
  fVar85 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar45 + 1) * (long)pvVar7);
  fVar86 = *pfVar2;
  fVar100 = pfVar2[1];
  fVar101 = pfVar2[2];
  fVar102 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (uVar45 + 2) * (long)pvVar7);
  fVar119 = *pfVar2;
  fVar121 = pfVar2[1];
  fVar134 = pfVar2[2];
  fVar135 = pfVar2[3];
  pfVar2 = (float *)(_Var8 + (long)pvVar7 * (uVar45 + 3));
  fVar136 = *pfVar2;
  fVar141 = pfVar2[1];
  fVar142 = pfVar2[2];
  fVar143 = pfVar2[3];
  local_2e0 = local_2e0 - 1 & local_2e0;
  lVar9 = *(long *)&pGVar5[1].time_range.upper;
  pfVar2 = (float *)(lVar9 + (long)p_Var41 * uVar45);
  fVar151 = *pfVar2;
  fVar152 = pfVar2[1];
  fVar153 = pfVar2[2];
  fVar169 = pfVar2[3];
  pfVar2 = (float *)(lVar9 + (long)p_Var41 * (uVar45 + 1));
  fVar170 = *pfVar2;
  fVar171 = pfVar2[1];
  fVar189 = pfVar2[2];
  fVar190 = pfVar2[3];
  pfVar2 = (float *)(lVar9 + (long)p_Var41 * (uVar45 + 2));
  fVar191 = *pfVar2;
  fVar204 = pfVar2[1];
  fVar205 = pfVar2[2];
  fVar206 = pfVar2[3];
  lVar10 = 0;
  if (local_2e0 != 0) {
    for (; (local_2e0 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar2 = (float *)(lVar9 + (long)p_Var41 * (uVar45 + 3));
  fVar213 = *pfVar2;
  fVar214 = pfVar2[1];
  fVar215 = pfVar2[2];
  fVar221 = pfVar2[3];
  if ((local_2e0 != 0) && (uVar45 = local_2e0 - 1 & local_2e0, uVar45 != 0)) {
    lVar9 = 0;
    if (uVar45 != 0) {
      for (; (uVar45 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
      }
    }
    uVar44 = (ulong)*(uint *)(uVar44 + _Var6 * *(uint *)(prim + lVar9 * 4 + 6));
  }
  fVar223 = fVar191 * 0.0 + fVar213 * -0.0 + fVar170 + fVar151 * -0.0;
  fVar226 = fVar204 * 0.0 + fVar214 * -0.0 + fVar171 + fVar152 * -0.0;
  fVar231 = fVar205 * 0.0 + fVar215 * -0.0 + fVar189 + fVar153 * -0.0;
  fVar232 = fVar206 * 0.0 + fVar221 * -0.0 + fVar190 + fVar169 * -0.0;
  fVar233 = (fVar191 * 0.5 + fVar213 * 0.0 + fVar170 * 0.0) - fVar151 * 0.5;
  fVar234 = (fVar204 * 0.5 + fVar214 * 0.0 + fVar171 * 0.0) - fVar152 * 0.5;
  fVar240 = (fVar205 * 0.5 + fVar215 * 0.0 + fVar189 * 0.0) - fVar153 * 0.5;
  fVar242 = (fVar206 * 0.5 + fVar221 * 0.0 + fVar190 * 0.0) - fVar169 * 0.5;
  fVar235 = (fVar119 * 0.5 + fVar136 * 0.0 + fVar86 * 0.0) - fVar120 * 0.5;
  fVar241 = (fVar121 * 0.5 + fVar141 * 0.0 + fVar100 * 0.0) - fVar54 * 0.5;
  fVar243 = (fVar134 * 0.5 + fVar142 * 0.0 + fVar101 * 0.0) - fVar84 * 0.5;
  fVar245 = (fVar135 * 0.5 + fVar143 * 0.0 + fVar102 * 0.0) - fVar85 * 0.5;
  fVar216 = fVar119 * 0.0 + fVar136 * -0.0 + fVar86 + fVar120 * -0.0;
  fVar222 = fVar121 * 0.0 + fVar141 * -0.0 + fVar100 + fVar54 * -0.0;
  fVar224 = fVar134 * 0.0 + fVar142 * -0.0 + fVar101 + fVar84 * -0.0;
  fVar225 = fVar135 * 0.0 + fVar143 * -0.0 + fVar102 + fVar85 * -0.0;
  fVar244 = fVar213 * -0.0 + fVar191 + fVar170 * 0.0 + fVar151 * -0.0;
  fVar246 = fVar214 * -0.0 + fVar204 + fVar171 * 0.0 + fVar152 * -0.0;
  fVar250 = fVar215 * -0.0 + fVar205 + fVar189 * 0.0 + fVar153 * -0.0;
  fVar251 = fVar221 * -0.0 + fVar206 + fVar190 * 0.0 + fVar169 * -0.0;
  fVar151 = fVar151 * 0.0 + ((fVar213 * 0.5 + fVar191 * 0.0) - fVar170 * 0.5);
  fVar152 = fVar152 * 0.0 + ((fVar214 * 0.5 + fVar204 * 0.0) - fVar171 * 0.5);
  fVar153 = fVar153 * 0.0 + ((fVar215 * 0.5 + fVar205 * 0.0) - fVar189 * 0.5);
  fVar169 = fVar169 * 0.0 + ((fVar221 * 0.5 + fVar206 * 0.0) - fVar190 * 0.5);
  fVar170 = fVar136 * -0.0 + fVar119 + fVar86 * 0.0 + fVar120 * -0.0;
  fVar171 = fVar141 * -0.0 + fVar121 + fVar100 * 0.0 + fVar54 * -0.0;
  fVar189 = fVar142 * -0.0 + fVar134 + fVar101 * 0.0 + fVar84 * -0.0;
  fVar190 = fVar143 * -0.0 + fVar135 + fVar102 * 0.0 + fVar85 * -0.0;
  fVar120 = fVar120 * 0.0 + ((fVar136 * 0.5 + fVar119 * 0.0) - fVar86 * 0.5);
  fVar54 = fVar54 * 0.0 + ((fVar141 * 0.5 + fVar121 * 0.0) - fVar100 * 0.5);
  fVar84 = fVar84 * 0.0 + ((fVar142 * 0.5 + fVar134 * 0.0) - fVar101 * 0.5);
  fVar85 = fVar85 * 0.0 + ((fVar143 * 0.5 + fVar135 * 0.0) - fVar102 * 0.5);
  fVar191 = fVar234 * fVar216 - fVar222 * fVar233;
  fVar205 = fVar240 * fVar222 - fVar224 * fVar234;
  fVar206 = fVar233 * fVar224 - fVar216 * fVar240;
  fVar213 = fVar242 * fVar225 - fVar225 * fVar242;
  fVar136 = fVar234 * fVar235 - fVar241 * fVar233;
  fVar142 = fVar240 * fVar241 - fVar243 * fVar234;
  fVar143 = fVar233 * fVar243 - fVar235 * fVar240;
  fVar102 = fVar152 * fVar170 - fVar171 * fVar151;
  fVar121 = fVar153 * fVar171 - fVar189 * fVar152;
  fVar134 = fVar151 * fVar189 - fVar170 * fVar153;
  fVar135 = fVar169 * fVar190 - fVar190 * fVar169;
  fVar86 = fVar152 * fVar120 - fVar54 * fVar151;
  fVar54 = fVar153 * fVar54 - fVar84 * fVar152;
  fVar84 = fVar151 * fVar84 - fVar120 * fVar153;
  fVar171 = fVar206 * fVar206 + fVar205 * fVar205 + fVar191 * fVar191;
  auVar194 = ZEXT416((uint)fVar171);
  auVar62 = rsqrtss(ZEXT416((uint)fVar171),auVar194);
  fVar120 = auVar62._0_4_;
  fVar189 = fVar120 * 1.5 - fVar120 * fVar120 * fVar171 * 0.5 * fVar120;
  fVar204 = fVar191 * fVar136 + fVar206 * fVar143 + fVar205 * fVar142;
  fVar120 = fVar213 * fVar189;
  auVar62 = rcpss(auVar194,auVar194);
  fVar141 = (2.0 - fVar171 * auVar62._0_4_) * auVar62._0_4_;
  fVar170 = fVar134 * fVar134 + fVar121 * fVar121 + fVar102 * fVar102;
  auVar62 = ZEXT416((uint)fVar170);
  auVar194 = rsqrtss(ZEXT416((uint)fVar170),auVar62);
  fVar100 = auVar194._0_4_;
  fVar119 = fVar100 * 1.5 - fVar100 * fVar100 * fVar170 * 0.5 * fVar100;
  fVar190 = fVar102 * fVar86 + fVar134 * fVar84 + fVar121 * fVar54;
  fVar101 = fVar135 * fVar119;
  auVar62 = rcpss(auVar62,auVar62);
  fVar100 = (2.0 - fVar170 * auVar62._0_4_) * auVar62._0_4_;
  local_388 = fVar232 * fVar205 * fVar189;
  fStack_384 = fVar232 * fVar206 * fVar189;
  fStack_380 = fVar232 * fVar191 * fVar189;
  fStack_37c = fVar232 * fVar120;
  local_338 = fVar223 - local_388;
  fStack_334 = fVar226 - fStack_384;
  fStack_330 = fVar231 - fStack_380;
  fStack_32c = fVar232 - fStack_37c;
  fVar205 = fVar232 * fVar141 * (fVar171 * fVar142 - fVar204 * fVar205) * fVar189 +
            fVar242 * fVar205 * fVar189;
  fVar206 = fVar232 * fVar141 * (fVar171 * fVar143 - fVar204 * fVar206) * fVar189 +
            fVar242 * fVar206 * fVar189;
  fVar136 = fVar232 * fVar141 * (fVar171 * fVar136 - fVar204 * fVar191) * fVar189 +
            fVar242 * fVar191 * fVar189;
  fVar171 = fVar232 * fVar141 * (fVar171 * (fVar242 * fVar245 - fVar245 * fVar242) -
                                fVar204 * fVar213) * fVar189 + fVar242 * fVar120;
  local_388 = local_388 + fVar223;
  fStack_384 = fStack_384 + fVar226;
  fStack_380 = fStack_380 + fVar231;
  fStack_37c = fStack_37c + fVar232;
  local_398 = fVar251 * fVar121 * fVar119;
  fStack_394 = fVar251 * fVar134 * fVar119;
  fStack_390 = fVar251 * fVar102 * fVar119;
  fStack_38c = fVar251 * fVar101;
  local_358 = fVar244 - local_398;
  fStack_354 = fVar246 - fStack_394;
  fStack_350 = fVar250 - fStack_390;
  fStack_34c = fVar251 - fStack_38c;
  fVar120 = fVar251 * fVar100 * (fVar170 * fVar54 - fVar190 * fVar121) * fVar119 +
            fVar169 * fVar121 * fVar119;
  fVar54 = fVar251 * fVar100 * (fVar170 * fVar84 - fVar190 * fVar134) * fVar119 +
           fVar169 * fVar134 * fVar119;
  fVar84 = fVar251 * fVar100 * (fVar170 * fVar86 - fVar190 * fVar102) * fVar119 +
           fVar169 * fVar102 * fVar119;
  fVar85 = fVar251 * fVar100 * (fVar170 * (fVar169 * fVar85 - fVar85 * fVar169) - fVar190 * fVar135)
                     * fVar119 + fVar169 * fVar101;
  local_398 = local_398 + fVar244;
  fStack_394 = fStack_394 + fVar246;
  fStack_390 = fStack_390 + fVar250;
  fStack_38c = fStack_38c + fVar251;
  local_348 = (fVar233 - fVar205) * 0.33333334 + local_338;
  fStack_344 = (fVar234 - fVar206) * 0.33333334 + fStack_334;
  fStack_340 = (fVar240 - fVar136) * 0.33333334 + fStack_330;
  fStack_33c = (fVar242 - fVar171) * 0.33333334 + fStack_32c;
  local_368 = local_358 - (fVar151 - fVar120) * 0.33333334;
  fStack_364 = fStack_354 - (fVar152 - fVar54) * 0.33333334;
  fStack_360 = fStack_350 - (fVar153 - fVar84) * 0.33333334;
  fStack_35c = fStack_34c - (fVar169 - fVar85) * 0.33333334;
  local_3a8 = local_398 - (fVar120 + fVar151) * 0.33333334;
  fStack_3a4 = fStack_394 - (fVar54 + fVar152) * 0.33333334;
  fStack_3a0 = fStack_390 - (fVar84 + fVar153) * 0.33333334;
  fStack_39c = fStack_38c - (fVar85 + fVar169) * 0.33333334;
  fVar120 = (local_418->org).field_0.m128[0];
  fVar54 = (local_418->org).field_0.m128[1];
  fVar84 = (local_418->org).field_0.m128[2];
  fVar85 = (pre->ray_space).vx.field_0.m128[0];
  fVar86 = (pre->ray_space).vx.field_0.m128[1];
  fVar100 = (pre->ray_space).vy.field_0.m128[0];
  fVar101 = (pre->ray_space).vy.field_0.m128[1];
  fVar102 = (pre->ray_space).vz.field_0.m128[0];
  fVar119 = (pre->ray_space).vz.field_0.m128[1];
  fVar189 = (local_338 - fVar120) * fVar85 +
            (fStack_334 - fVar54) * fVar100 + (fStack_330 - fVar84) * fVar102;
  fVar190 = (local_338 - fVar120) * fVar86 +
            (fStack_334 - fVar54) * fVar101 + (fStack_330 - fVar84) * fVar119;
  local_1f8 = CONCAT44(fVar190,fVar189);
  fVar152 = (local_348 - fVar120) * fVar85 +
            (fStack_344 - fVar54) * fVar100 + (fStack_340 - fVar84) * fVar102;
  fVar153 = (local_348 - fVar120) * fVar86 +
            (fStack_344 - fVar54) * fVar101 + (fStack_340 - fVar84) * fVar119;
  local_208 = CONCAT44(fVar153,fVar152);
  fVar169 = (local_368 - fVar120) * fVar85 +
            (fStack_364 - fVar54) * fVar100 + (fStack_360 - fVar84) * fVar102;
  fVar170 = (local_368 - fVar120) * fVar86 +
            (fStack_364 - fVar54) * fVar101 + (fStack_360 - fVar84) * fVar119;
  local_218 = CONCAT44(fVar170,fVar169);
  fVar143 = (local_358 - fVar120) * fVar85 +
            (fStack_354 - fVar54) * fVar100 + (fStack_350 - fVar84) * fVar102;
  fVar151 = (local_358 - fVar120) * fVar86 +
            (fStack_354 - fVar54) * fVar101 + (fStack_350 - fVar84) * fVar119;
  local_228 = CONCAT44(fVar151,fVar143);
  fVar141 = (local_388 - fVar120) * fVar85 +
            (fStack_384 - fVar54) * fVar100 + (fStack_380 - fVar84) * fVar102;
  fVar142 = (local_388 - fVar120) * fVar86 +
            (fStack_384 - fVar54) * fVar101 + (fStack_380 - fVar84) * fVar119;
  local_238 = CONCAT44(fVar142,fVar141);
  local_2a8 = (fVar205 + fVar233) * 0.33333334 + local_388;
  fStack_2a4 = (fVar206 + fVar234) * 0.33333334 + fStack_384;
  fStack_2a0 = (fVar136 + fVar240) * 0.33333334 + fStack_380;
  fStack_29c = (fVar171 + fVar242) * 0.33333334 + fStack_37c;
  fVar135 = (local_2a8 - fVar120) * fVar85 +
            (fStack_2a4 - fVar54) * fVar100 + (fStack_2a0 - fVar84) * fVar102;
  fVar136 = (local_2a8 - fVar120) * fVar86 +
            (fStack_2a4 - fVar54) * fVar101 + (fStack_2a0 - fVar84) * fVar119;
  local_248 = CONCAT44(fVar136,fVar135);
  fVar121 = (local_3a8 - fVar120) * fVar85 +
            (fStack_3a4 - fVar54) * fVar100 + (fStack_3a0 - fVar84) * fVar102;
  fVar134 = (local_3a8 - fVar120) * fVar86 +
            (fStack_3a4 - fVar54) * fVar101 + (fStack_3a0 - fVar84) * fVar119;
  local_258 = CONCAT44(fVar134,fVar121);
  fVar85 = (local_398 - fVar120) * fVar85 +
           (fStack_394 - fVar54) * fVar100 + (fStack_390 - fVar84) * fVar102;
  fVar120 = (local_398 - fVar120) * fVar86 +
            (fStack_394 - fVar54) * fVar101 + (fStack_390 - fVar84) * fVar119;
  local_268 = CONCAT44(fVar120,fVar85);
  register0x00001308 = local_248;
  local_318 = local_208;
  register0x00001408 = local_268;
  local_3d8 = local_228;
  auVar76._8_4_ = fVar141;
  auVar76._0_8_ = local_1f8;
  auVar76._12_4_ = fVar142;
  auVar62 = minps(auVar76,_local_318);
  auVar93._8_4_ = fVar121;
  auVar93._0_8_ = local_218;
  auVar93._12_4_ = fVar134;
  auVar194 = minps(auVar93,_local_3d8);
  auVar62 = minps(auVar62,auVar194);
  auVar94._4_4_ = fVar190;
  auVar94._0_4_ = fVar189;
  auVar94._8_4_ = fVar141;
  auVar94._12_4_ = fVar142;
  auVar194 = maxps(auVar94,_local_318);
  auVar105._4_4_ = fVar170;
  auVar105._0_4_ = fVar169;
  auVar105._8_4_ = fVar121;
  auVar105._12_4_ = fVar134;
  auVar106 = maxps(auVar105,_local_3d8);
  auVar95 = maxps(auVar194,auVar106);
  auVar11._4_8_ = auVar106._8_8_;
  auVar11._0_4_ = auVar62._4_4_;
  auVar107._0_8_ = auVar11._0_8_ << 0x20;
  auVar107._8_4_ = auVar62._8_4_;
  auVar107._12_4_ = auVar62._12_4_;
  auVar108._8_8_ = auVar62._8_8_;
  auVar108._0_8_ = auVar107._8_8_;
  auVar194 = minps(auVar62,auVar108);
  auVar12._4_8_ = auVar62._8_8_;
  auVar12._0_4_ = auVar95._4_4_;
  auVar109._0_8_ = auVar12._0_8_ << 0x20;
  auVar109._8_4_ = auVar95._8_4_;
  auVar109._12_4_ = auVar95._12_4_;
  auVar110._8_8_ = auVar95._8_8_;
  auVar110._0_8_ = auVar109._8_8_;
  auVar62 = maxps(auVar95,auVar110);
  auVar77._0_8_ = auVar194._0_8_ & 0x7fffffff7fffffff;
  auVar77._8_4_ = auVar194._8_4_ & 0x7fffffff;
  auVar77._12_4_ = auVar194._12_4_ & 0x7fffffff;
  auVar96._0_8_ = auVar62._0_8_ & 0x7fffffff7fffffff;
  auVar96._8_4_ = auVar62._8_4_ & 0x7fffffff;
  auVar96._12_4_ = auVar62._12_4_ & 0x7fffffff;
  auVar62 = maxps(auVar77,auVar96);
  fStack_2f4 = auVar62._4_4_;
  local_2f8 = fStack_2f4;
  if (fStack_2f4 <= auVar62._0_4_) {
    local_2f8 = auVar62._0_4_;
  }
  local_2f8 = local_2f8 * 9.536743e-07;
  uStack_1f0 = local_1f8;
  uStack_200 = local_208;
  uStack_210 = local_218;
  uStack_220 = local_228;
  uStack_230 = local_238;
  uStack_240 = local_248;
  uStack_250 = local_258;
  uStack_260 = local_268;
  fStack_2f0 = fStack_2f4;
  fStack_2ec = fStack_2f4;
  local_138 = local_2f8;
  fStack_134 = local_2f8;
  fStack_130 = local_2f8;
  fStack_12c = local_2f8;
  local_148 = -local_2f8;
  fStack_144 = -local_2f8;
  fStack_140 = -local_2f8;
  fStack_13c = -local_2f8;
  local_88 = fVar152 - fVar189;
  fStack_84 = fVar153 - fVar190;
  fStack_80 = fVar135 - fVar141;
  fStack_7c = fVar136 - fVar142;
  local_98 = fVar169 - fVar152;
  fStack_94 = fVar170 - fVar153;
  fStack_90 = fVar121 - fVar135;
  fStack_8c = fVar134 - fVar136;
  local_a8 = fVar143 - fVar169;
  fStack_a4 = fVar151 - fVar170;
  fStack_a0 = fVar85 - fVar121;
  fStack_9c = fVar120 - fVar134;
  local_178 = local_388 - local_338;
  fStack_174 = fStack_384 - fStack_334;
  fStack_170 = fStack_380 - fStack_330;
  fStack_16c = fStack_37c - fStack_32c;
  local_188 = local_2a8 - local_348;
  fStack_184 = fStack_2a4 - fStack_344;
  fStack_180 = fStack_2a0 - fStack_340;
  fStack_17c = fStack_29c - fStack_33c;
  local_198 = local_3a8 - local_368;
  fStack_194 = fStack_3a4 - fStack_364;
  fStack_190 = fStack_3a0 - fStack_360;
  fStack_18c = fStack_39c - fStack_35c;
  local_1a8 = local_398 - local_358;
  fStack_1a4 = fStack_394 - fStack_354;
  fStack_1a0 = fStack_390 - fStack_350;
  fStack_19c = fStack_38c - fStack_34c;
  local_42c = 0;
  uVar45 = 0;
  local_3f8 = 0x3f80000000000000;
  uStack_3f0 = 0;
  local_3e8 = 0x3f80000000000000;
  uStack_3e0 = 0;
  local_308 = local_1f8;
  uStack_300 = local_238;
  local_328 = local_218;
  uStack_320 = local_258;
  pRVar46 = local_418;
  do {
    fVar120 = 1.0 - (float)local_3f8;
    fVar54 = 1.0 - (float)local_3f8;
    fVar84 = 1.0 - local_3f8._4_4_;
    fVar85 = 1.0 - local_3f8._4_4_;
    fVar86 = (float)local_1f8 * fVar120 + (float)local_238 * (float)local_3f8;
    fVar136 = local_1f8._4_4_ * fVar54 + local_238._4_4_ * (float)local_3f8;
    fVar141 = (float)uStack_1f0 * fVar84 + (float)uStack_230 * local_3f8._4_4_;
    fVar142 = uStack_1f0._4_4_ * fVar85 + uStack_230._4_4_ * local_3f8._4_4_;
    fVar121 = (float)local_208 * fVar120 + (float)local_248 * (float)local_3f8;
    fVar169 = local_208._4_4_ * fVar54 + local_248._4_4_ * (float)local_3f8;
    fVar170 = (float)uStack_200 * fVar84 + (float)uStack_240 * local_3f8._4_4_;
    fVar171 = uStack_200._4_4_ * fVar85 + uStack_240._4_4_ * local_3f8._4_4_;
    fVar189 = (float)local_218 * fVar120 + (float)local_258 * (float)local_3f8;
    fVar190 = local_218._4_4_ * fVar54 + local_258._4_4_ * (float)local_3f8;
    fVar191 = (float)uStack_210 * fVar84 + (float)uStack_250 * local_3f8._4_4_;
    fVar204 = uStack_210._4_4_ * fVar85 + uStack_250._4_4_ * local_3f8._4_4_;
    fVar231 = fVar120 * (float)local_228 + (float)local_3f8 * (float)local_268;
    fVar232 = fVar54 * local_228._4_4_ + (float)local_3f8 * local_268._4_4_;
    fVar233 = fVar84 * (float)uStack_220 + local_3f8._4_4_ * (float)uStack_260;
    fVar234 = fVar85 * uStack_220._4_4_ + local_3f8._4_4_ * uStack_260._4_4_;
    fVar120 = (local_3e8._4_4_ - (float)local_3e8) * 0.11111111;
    fVar205 = (local_3e8._4_4_ - (float)local_3e8) * 0.0 + (float)local_3e8;
    fVar206 = (local_3e8._4_4_ - (float)local_3e8) * 0.33333334 + (float)local_3e8;
    fVar213 = (local_3e8._4_4_ - (float)local_3e8) * 0.6666667 + (float)local_3e8;
    fVar214 = (local_3e8._4_4_ - (float)local_3e8) * 1.0 + (float)local_3e8;
    fVar215 = 1.0 - fVar205;
    fVar221 = 1.0 - fVar206;
    fVar223 = 1.0 - fVar213;
    fVar226 = 1.0 - fVar214;
    fVar100 = fVar121 * fVar215 + fVar189 * fVar205;
    fVar101 = fVar121 * fVar221 + fVar189 * fVar206;
    fVar102 = fVar121 * fVar223 + fVar189 * fVar213;
    fVar119 = fVar121 * fVar226 + fVar189 * fVar214;
    fVar143 = fVar169 * fVar215 + fVar190 * fVar205;
    fVar151 = fVar169 * fVar221 + fVar190 * fVar206;
    fVar152 = fVar169 * fVar223 + fVar190 * fVar213;
    fVar153 = fVar169 * fVar226 + fVar190 * fVar214;
    fVar54 = (fVar86 * fVar215 + fVar121 * fVar205) * fVar215 + fVar205 * fVar100;
    fVar84 = (fVar86 * fVar221 + fVar121 * fVar206) * fVar221 + fVar206 * fVar101;
    fVar85 = (fVar86 * fVar223 + fVar121 * fVar213) * fVar223 + fVar213 * fVar102;
    fVar86 = (fVar86 * fVar226 + fVar121 * fVar214) * fVar226 + fVar214 * fVar119;
    fVar121 = (fVar136 * fVar215 + fVar169 * fVar205) * fVar215 + fVar205 * fVar143;
    fVar134 = (fVar136 * fVar221 + fVar169 * fVar206) * fVar221 + fVar206 * fVar151;
    fVar135 = (fVar136 * fVar223 + fVar169 * fVar213) * fVar223 + fVar213 * fVar152;
    fVar136 = (fVar136 * fVar226 + fVar169 * fVar214) * fVar226 + fVar214 * fVar153;
    fVar100 = fVar100 * fVar215 + (fVar189 * fVar215 + fVar231 * fVar205) * fVar205;
    fVar101 = fVar101 * fVar221 + (fVar189 * fVar221 + fVar231 * fVar206) * fVar206;
    fVar102 = fVar102 * fVar223 + (fVar189 * fVar223 + fVar231 * fVar213) * fVar213;
    fVar119 = fVar119 * fVar226 + (fVar189 * fVar226 + fVar231 * fVar214) * fVar214;
    fVar143 = fVar143 * fVar215 + (fVar190 * fVar215 + fVar232 * fVar205) * fVar205;
    fVar151 = fVar151 * fVar221 + (fVar190 * fVar221 + fVar232 * fVar206) * fVar206;
    fVar152 = fVar152 * fVar223 + (fVar190 * fVar223 + fVar232 * fVar213) * fVar213;
    fVar153 = fVar153 * fVar226 + (fVar190 * fVar226 + fVar232 * fVar214) * fVar214;
    local_298 = fVar215 * fVar54 + fVar205 * fVar100;
    fStack_294 = fVar221 * fVar84 + fVar206 * fVar101;
    fStack_290 = fVar223 * fVar85 + fVar213 * fVar102;
    fStack_28c = fVar226 * fVar86 + fVar214 * fVar119;
    local_288 = fVar215 * fVar121 + fVar205 * fVar143;
    fStack_284 = fVar221 * fVar134 + fVar206 * fVar151;
    fStack_280 = fVar223 * fVar135 + fVar213 * fVar152;
    fStack_27c = fVar226 * fVar136 + fVar214 * fVar153;
    fVar101 = (fVar101 - fVar84) * 3.0 * fVar120;
    fVar85 = (fVar102 - fVar85) * 3.0 * fVar120;
    fVar86 = (fVar119 - fVar86) * 3.0 * fVar120;
    fVar102 = (fVar151 - fVar134) * 3.0 * fVar120;
    fVar119 = (fVar152 - fVar135) * 3.0 * fVar120;
    fVar134 = (fVar153 - fVar136) * 3.0 * fVar120;
    local_d8._4_4_ = fStack_290;
    local_d8._0_4_ = fStack_294;
    local_b8._4_4_ = fStack_280;
    local_b8._0_4_ = fStack_284;
    local_378._0_4_ = local_298 + (fVar100 - fVar54) * 3.0 * fVar120;
    local_378._4_4_ = fStack_294 + fVar101;
    fStack_370 = fStack_290 + fVar85;
    fStack_36c = fStack_28c + fVar86;
    fVar54 = local_288 + (fVar143 - fVar121) * 3.0 * fVar120;
    fVar84 = fStack_284 + fVar102;
    fStack_420 = fStack_280 + fVar119;
    fStack_41c = fStack_27c + fVar134;
    local_278._0_4_ = fStack_294 - fVar101;
    local_278._4_4_ = fStack_290 - fVar85;
    local_278._8_4_ = fStack_28c - fVar86;
    local_278._12_4_ = 0;
    local_b8._8_4_ = fStack_27c;
    local_b8._12_4_ = 0;
    local_c8._0_4_ = fStack_284 - fVar102;
    local_c8._4_4_ = fStack_280 - fVar119;
    local_c8._8_4_ = fStack_27c - fVar134;
    local_c8._12_4_ = 0;
    fVar85 = fVar170 * fVar215 + fVar191 * fVar205;
    fVar86 = fVar170 * fVar221 + fVar191 * fVar206;
    fVar100 = fVar170 * fVar223 + fVar191 * fVar213;
    fVar101 = fVar170 * fVar226 + fVar191 * fVar214;
    fVar102 = fVar171 * fVar215 + fVar204 * fVar205;
    fVar119 = fVar171 * fVar221 + fVar204 * fVar206;
    fVar121 = fVar171 * fVar223 + fVar204 * fVar213;
    fVar134 = fVar171 * fVar226 + fVar204 * fVar214;
    fVar143 = (fVar141 * fVar215 + fVar170 * fVar205) * fVar215 + fVar205 * fVar85;
    fVar151 = (fVar141 * fVar221 + fVar170 * fVar206) * fVar221 + fVar206 * fVar86;
    fVar152 = (fVar141 * fVar223 + fVar170 * fVar213) * fVar223 + fVar213 * fVar100;
    fVar153 = (fVar141 * fVar226 + fVar170 * fVar214) * fVar226 + fVar214 * fVar101;
    fVar135 = (fVar142 * fVar215 + fVar171 * fVar205) * fVar215 + fVar205 * fVar102;
    fVar136 = (fVar142 * fVar221 + fVar171 * fVar206) * fVar221 + fVar206 * fVar119;
    fVar141 = (fVar142 * fVar223 + fVar171 * fVar213) * fVar223 + fVar213 * fVar121;
    fVar142 = (fVar142 * fVar226 + fVar171 * fVar214) * fVar226 + fVar214 * fVar134;
    fVar85 = fVar85 * fVar215 + (fVar191 * fVar215 + fVar233 * fVar205) * fVar205;
    fVar86 = fVar86 * fVar221 + (fVar191 * fVar221 + fVar233 * fVar206) * fVar206;
    fVar100 = fVar100 * fVar223 + (fVar191 * fVar223 + fVar233 * fVar213) * fVar213;
    fVar101 = fVar101 * fVar226 + (fVar191 * fVar226 + fVar233 * fVar214) * fVar214;
    fVar169 = fVar102 * fVar215 + (fVar204 * fVar215 + fVar234 * fVar205) * fVar205;
    fVar170 = fVar119 * fVar221 + (fVar204 * fVar221 + fVar234 * fVar206) * fVar206;
    fVar171 = fVar121 * fVar223 + (fVar204 * fVar223 + fVar234 * fVar213) * fVar213;
    fVar189 = fVar134 * fVar226 + (fVar204 * fVar226 + fVar234 * fVar214) * fVar214;
    fVar102 = fVar215 * fVar143 + fVar205 * fVar85;
    fVar119 = fVar221 * fVar151 + fVar206 * fVar86;
    fVar121 = fVar223 * fVar152 + fVar213 * fVar100;
    fVar134 = fVar226 * fVar153 + fVar214 * fVar101;
    fVar190 = fVar215 * fVar135 + fVar205 * fVar169;
    fVar191 = fVar221 * fVar136 + fVar206 * fVar170;
    fVar204 = fVar223 * fVar141 + fVar213 * fVar171;
    fVar205 = fVar226 * fVar142 + fVar214 * fVar189;
    fVar86 = (fVar86 - fVar151) * 3.0 * fVar120;
    fVar100 = (fVar100 - fVar152) * 3.0 * fVar120;
    fVar101 = (fVar101 - fVar153) * 3.0 * fVar120;
    fVar136 = (fVar170 - fVar136) * 3.0 * fVar120;
    fVar141 = (fVar171 - fVar141) * 3.0 * fVar120;
    fVar142 = (fVar189 - fVar142) * 3.0 * fVar120;
    local_e8._4_4_ = fVar121;
    local_e8._0_4_ = fVar119;
    local_e8._8_4_ = fVar134;
    local_e8._12_4_ = 0;
    local_108._4_4_ = fVar204;
    local_108._0_4_ = fVar191;
    local_108._8_4_ = fVar205;
    local_108._12_4_ = 0;
    local_3b8 = fVar102 + (fVar85 - fVar143) * 3.0 * fVar120;
    fStack_3b4 = fVar119 + fVar86;
    fStack_3b0 = fVar121 + fVar100;
    fStack_3ac = fVar134 + fVar101;
    local_f8 = fVar190 + (fVar169 - fVar135) * 3.0 * fVar120;
    fStack_f4 = fVar191 + fVar136;
    fStack_f0 = fVar204 + fVar141;
    fStack_ec = fVar205 + fVar142;
    local_128._0_4_ = fVar119 - fVar86;
    local_128._4_4_ = fVar121 - fVar100;
    local_128._8_4_ = fVar134 - fVar101;
    local_128._12_4_ = 0;
    local_118._0_4_ = fVar191 - fVar136;
    local_118._4_4_ = fVar204 - fVar141;
    local_118._8_4_ = fVar205 - fVar142;
    local_118._12_4_ = 0;
    local_d8._8_4_ = fStack_28c;
    local_d8._12_4_ = 0;
    fVar101 = (fVar119 - fStack_294) + (fVar102 - local_298);
    fVar135 = (fVar121 - fStack_290) + (fVar119 - fStack_294);
    fVar136 = (fVar134 - fStack_28c) + (fVar121 - fStack_290);
    fVar141 = (fVar134 - fStack_28c) + 0.0;
    fVar120 = (fVar191 - fStack_284) + (fVar190 - local_288);
    fVar85 = (fVar204 - fStack_280) + (fVar191 - fStack_284);
    fVar86 = (fVar205 - fStack_27c) + (fVar204 - fStack_280);
    fVar100 = (fVar205 - fStack_27c) + 0.0;
    auVar145._0_8_ =
         CONCAT44(fStack_284 * fVar135 - fStack_294 * fVar85,
                  local_288 * fVar101 - local_298 * fVar120);
    auVar145._8_4_ = fStack_280 * fVar136 - fStack_290 * fVar86;
    auVar145._12_4_ = fStack_27c * fVar141 - fStack_28c * fVar100;
    auVar111._0_4_ = fVar54 * fVar101 - (float)local_378._0_4_ * fVar120;
    auVar111._4_4_ = fVar84 * fVar135 - (float)local_378._4_4_ * fVar85;
    auVar111._8_4_ = fStack_420 * fVar136 - fStack_370 * fVar86;
    auVar111._12_4_ = fStack_41c * fVar141 - fStack_36c * fVar100;
    auVar124._0_8_ =
         CONCAT44(local_c8._4_4_ * fVar135 - fVar85 * local_278._4_4_,
                  local_c8._0_4_ * fVar101 - fVar120 * local_278._0_4_);
    auVar124._8_4_ = local_c8._8_4_ * fVar136 - fVar86 * local_278._8_4_;
    auVar124._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
    auVar259._0_4_ = fVar101 * fStack_284 - fVar120 * fStack_294;
    auVar259._4_4_ = fVar135 * fStack_280 - fVar85 * fStack_290;
    auVar259._8_4_ = fVar136 * fStack_27c - fVar86 * fStack_28c;
    auVar259._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
    auVar78._0_8_ =
         CONCAT44(fVar191 * fVar135 - fVar119 * fVar85,fVar190 * fVar101 - fVar102 * fVar120);
    auVar78._8_4_ = fVar204 * fVar136 - fVar121 * fVar86;
    auVar78._12_4_ = fVar205 * fVar141 - fVar134 * fVar100;
    auVar228._0_4_ = local_f8 * fVar101 - local_3b8 * fVar120;
    auVar228._4_4_ = fStack_f4 * fVar135 - fStack_3b4 * fVar85;
    auVar228._8_4_ = fStack_f0 * fVar136 - fStack_3b0 * fVar86;
    auVar228._12_4_ = fStack_ec * fVar141 - fStack_3ac * fVar100;
    auVar195._0_8_ =
         CONCAT44(local_118._4_4_ * fVar135 - fVar85 * local_128._4_4_,
                  local_118._0_4_ * fVar101 - fVar120 * local_128._0_4_);
    auVar195._8_4_ = local_118._8_4_ * fVar136 - fVar86 * local_128._8_4_;
    auVar195._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
    auVar217._0_4_ = fVar101 * fVar191 - fVar120 * fVar119;
    auVar217._4_4_ = fVar135 * fVar204 - fVar85 * fVar121;
    auVar217._8_4_ = fVar136 * fVar205 - fVar86 * fVar134;
    auVar217._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
    auVar252._8_4_ = auVar145._8_4_;
    auVar252._0_8_ = auVar145._0_8_;
    auVar252._12_4_ = auVar145._12_4_;
    auVar95 = minps(auVar252,auVar111);
    auVar194 = maxps(auVar145,auVar111);
    auVar112._8_4_ = auVar124._8_4_;
    auVar112._0_8_ = auVar124._0_8_;
    auVar112._12_4_ = auVar124._12_4_;
    auVar62 = minps(auVar112,auVar259);
    auVar253 = minps(auVar95,auVar62);
    auVar62 = maxps(auVar124,auVar259);
    auVar106 = maxps(auVar194,auVar62);
    auVar113._8_4_ = auVar78._8_4_;
    auVar113._0_8_ = auVar78._0_8_;
    auVar113._12_4_ = auVar78._12_4_;
    auVar194 = minps(auVar113,auVar228);
    auVar62 = maxps(auVar78,auVar228);
    auVar125._8_4_ = auVar195._8_4_;
    auVar125._0_8_ = auVar195._0_8_;
    auVar125._12_4_ = auVar195._12_4_;
    auVar95 = minps(auVar125,auVar217);
    auVar194 = minps(auVar194,auVar95);
    auVar95 = minps(auVar253,auVar194);
    auVar194 = maxps(auVar195,auVar217);
    auVar62 = maxps(auVar62,auVar194);
    auVar62 = maxps(auVar106,auVar62);
    auVar146._0_4_ =
         -(uint)(local_148 <= auVar62._0_4_ && auVar95._0_4_ <= local_138) & local_158._0_4_;
    auVar146._4_4_ =
         -(uint)(fStack_144 <= auVar62._4_4_ && auVar95._4_4_ <= fStack_134) & local_158._4_4_;
    auVar146._8_4_ =
         -(uint)(fStack_140 <= auVar62._8_4_ && auVar95._8_4_ <= fStack_130) & local_158._8_4_;
    auVar146._12_4_ =
         -(uint)(fStack_13c <= auVar62._12_4_ && auVar95._12_4_ <= fStack_12c) & local_158._12_4_;
    iVar42 = movmskps((int)uVar44,auVar146);
    uVar39 = 0;
    if (iVar42 != 0) {
      fVar101 = (fVar119 - fVar102) + (fStack_294 - local_298);
      fVar135 = (fVar121 - fVar119) + (fStack_290 - fStack_294);
      fVar136 = (fVar134 - fVar121) + (fStack_28c - fStack_290);
      fVar141 = (0.0 - fVar134) + (0.0 - fStack_28c);
      fVar120 = (fVar191 - fVar190) + (fStack_284 - local_288);
      fVar85 = (fVar204 - fVar191) + (fStack_280 - fStack_284);
      fVar86 = (fVar205 - fVar204) + (fStack_27c - fStack_280);
      fVar100 = (0.0 - fVar205) + (0.0 - fStack_27c);
      auVar257._0_8_ =
           CONCAT44(fStack_284 * fVar135 - fStack_294 * fVar85,
                    local_288 * fVar101 - local_298 * fVar120);
      auVar257._8_4_ = fStack_280 * fVar136 - fStack_290 * fVar86;
      auVar257._12_4_ = fStack_27c * fVar141 - fStack_28c * fVar100;
      auVar114._0_4_ = fVar54 * fVar101 - (float)local_378._0_4_ * fVar120;
      auVar114._4_4_ = fVar84 * fVar135 - (float)local_378._4_4_ * fVar85;
      auVar114._8_4_ = fStack_420 * fVar136 - fStack_370 * fVar86;
      auVar114._12_4_ = fStack_41c * fVar141 - fStack_36c * fVar100;
      auVar186._0_8_ =
           CONCAT44(local_c8._4_4_ * fVar135 - local_278._4_4_ * fVar85,
                    local_c8._0_4_ * fVar101 - local_278._0_4_ * fVar120);
      auVar186._8_4_ = local_c8._8_4_ * fVar136 - local_278._8_4_ * fVar86;
      auVar186._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
      auVar126._0_4_ = fStack_284 * fVar101 - fStack_294 * fVar120;
      auVar126._4_4_ = fStack_280 * fVar135 - fStack_290 * fVar85;
      auVar126._8_4_ = fStack_27c * fVar136 - fStack_28c * fVar86;
      auVar126._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
      auVar247._0_8_ =
           CONCAT44(fVar191 * fVar135 - fVar119 * fVar85,fVar190 * fVar101 - fVar102 * fVar120);
      auVar247._8_4_ = fVar204 * fVar136 - fVar121 * fVar86;
      auVar247._12_4_ = fVar205 * fVar141 - fVar134 * fVar100;
      auVar139._0_4_ = local_f8 * fVar101 - local_3b8 * fVar120;
      auVar139._4_4_ = fStack_f4 * fVar135 - fStack_3b4 * fVar85;
      auVar139._8_4_ = fStack_f0 * fVar136 - fStack_3b0 * fVar86;
      auVar139._12_4_ = fStack_ec * fVar141 - fStack_3ac * fVar100;
      auVar229._0_8_ =
           CONCAT44(local_118._4_4_ * fVar135 - local_128._4_4_ * fVar85,
                    local_118._0_4_ * fVar101 - local_128._0_4_ * fVar120);
      auVar229._8_4_ = local_118._8_4_ * fVar136 - local_128._8_4_ * fVar86;
      auVar229._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
      auVar218._0_4_ = fVar101 * fVar191 - fVar120 * fVar119;
      auVar218._4_4_ = fVar135 * fVar204 - fVar85 * fVar121;
      auVar218._8_4_ = fVar136 * fVar205 - fVar86 * fVar134;
      auVar218._12_4_ = fVar141 * 0.0 - fVar100 * 0.0;
      auVar79._8_4_ = auVar257._8_4_;
      auVar79._0_8_ = auVar257._0_8_;
      auVar79._12_4_ = auVar257._12_4_;
      auVar62 = minps(auVar79,auVar114);
      auVar95 = maxps(auVar257,auVar114);
      auVar115._8_4_ = auVar186._8_4_;
      auVar115._0_8_ = auVar186._0_8_;
      auVar115._12_4_ = auVar186._12_4_;
      auVar194 = minps(auVar115,auVar126);
      auVar62 = minps(auVar62,auVar194);
      auVar194 = maxps(auVar186,auVar126);
      auVar253 = maxps(auVar95,auVar194);
      auVar116._8_4_ = auVar247._8_4_;
      auVar116._0_8_ = auVar247._0_8_;
      auVar116._12_4_ = auVar247._12_4_;
      auVar194 = minps(auVar116,auVar139);
      auVar106 = maxps(auVar247,auVar139);
      auVar127._8_4_ = auVar229._8_4_;
      auVar127._0_8_ = auVar229._0_8_;
      auVar127._12_4_ = auVar229._12_4_;
      auVar95 = minps(auVar127,auVar218);
      auVar194 = minps(auVar194,auVar95);
      auVar62 = minps(auVar62,auVar194);
      auVar194 = maxps(auVar229,auVar218);
      auVar194 = maxps(auVar106,auVar194);
      auVar194 = maxps(auVar253,auVar194);
      auVar259._0_4_ =
           (float)(-(uint)(local_148 <= auVar194._0_4_ && auVar62._0_4_ <= local_138) &
                  auVar146._0_4_);
      auVar259._4_4_ =
           (float)(-(uint)(fStack_144 <= auVar194._4_4_ && auVar62._4_4_ <= fStack_134) &
                  auVar146._4_4_);
      auVar259._8_4_ =
           (float)(-(uint)(fStack_140 <= auVar194._8_4_ && auVar62._8_4_ <= fStack_130) &
                  auVar146._8_4_);
      auVar259._12_4_ =
           (float)(-(uint)(fStack_13c <= auVar194._12_4_ && auVar62._12_4_ <= fStack_12c) &
                  auVar146._12_4_);
      uVar48 = movmskps(0,auVar259);
      uVar39 = (ulong)uVar48;
    }
    if ((uint)uVar39 != 0) {
      auStack_1e8[uVar45] = (uint)uVar39;
      *(undefined8 *)(afStack_78 + uVar45 * 2) = local_3e8;
      auStack_58[uVar45] = local_3f8;
      uVar45 = (ulong)((int)uVar45 + 1);
    }
    do {
      if ((int)uVar45 == 0) {
        if (local_42c != 0) {
          return local_42d;
        }
        fVar120 = pRVar46->tfar;
        auVar99._4_4_ = -(uint)(fStack_164 <= fVar120);
        auVar99._0_4_ = -(uint)(local_168 <= fVar120);
        auVar99._8_4_ = -(uint)(fStack_160 <= fVar120);
        auVar99._12_4_ = -(uint)(fStack_15c <= fVar120);
        uVar48 = movmskps((int)uVar39,auVar99);
        uVar48 = (uint)local_2e0 & uVar48;
        local_42d = uVar48 != 0;
        if (!local_42d) {
          return local_42d;
        }
        goto LAB_00b6dba3;
      }
      uVar49 = (int)uVar45 - 1;
      uVar40 = (ulong)uVar49;
      uVar48 = auStack_1e8[uVar40];
      local_3f8 = auStack_58[uVar40];
      uVar39 = 0;
      if (uVar48 != 0) {
        for (; (uVar48 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
        }
      }
      uVar48 = uVar48 - 1 & uVar48;
      auStack_1e8[uVar40] = uVar48;
      if (uVar48 == 0) {
        uVar45 = (ulong)uVar49;
      }
      uVar43 = uVar39 + 1;
      uVar44 = uVar43;
      if ((long)uVar43 < 0) {
        uVar44 = (ulong)((uint)uVar43 & 1) | uVar43 >> 1;
      }
      fVar120 = afStack_78[uVar40 * 2];
      fVar54 = *(float *)((long)auStack_58 + uVar40 * 8 + -0x1c);
      fVar84 = fVar120 * (1.0 - (float)uVar39 * 0.33333334) + fVar54 * (float)uVar39 * 0.33333334;
      fVar85 = fVar120 * (1.0 - (float)uVar43 * 0.33333334) + fVar54 * (float)uVar43 * 0.33333334;
      fVar86 = fVar120 * 0.0 + fVar54 * 0.0;
      fVar54 = fVar120 * 0.0 + fVar54 * 0.0;
      fVar120 = fVar85 - fVar84;
      uStack_3f0 = 0;
      local_3e8 = CONCAT44(fVar85,fVar84);
      uStack_3e0 = CONCAT44(fVar54,fVar86);
      if (0.16666667 <= fVar120) break;
      fVar141 = (float)local_3f8;
      fVar143 = (float)((ulong)local_3f8 >> 0x20);
      fVar100 = 1.0 - fVar141;
      fVar101 = 1.0 - fVar141;
      fVar102 = 1.0 - fVar143;
      fVar119 = 1.0 - fVar143;
      fVar121 = (float)local_1f8 * fVar100 + (float)local_238 * fVar141;
      fVar134 = local_1f8._4_4_ * fVar101 + local_238._4_4_ * fVar141;
      fVar135 = (float)uStack_1f0 * fVar102 + (float)uStack_230 * fVar143;
      fVar136 = uStack_1f0._4_4_ * fVar119 + uStack_230._4_4_ * fVar143;
      fVar169 = (float)local_208 * fVar100 + (float)local_248 * fVar141;
      fVar170 = local_208._4_4_ * fVar101 + local_248._4_4_ * fVar141;
      fVar171 = (float)uStack_200 * fVar102 + (float)uStack_240 * fVar143;
      fVar189 = uStack_200._4_4_ * fVar119 + uStack_240._4_4_ * fVar143;
      fVar190 = (float)local_218 * fVar100 + (float)local_258 * fVar141;
      fVar204 = local_218._4_4_ * fVar101 + local_258._4_4_ * fVar141;
      fVar206 = (float)uStack_210 * fVar102 + (float)uStack_250 * fVar143;
      fVar214 = uStack_210._4_4_ * fVar119 + uStack_250._4_4_ * fVar143;
      fVar142 = (fVar100 * (float)local_228 + fVar141 * (float)local_268) - fVar190;
      fVar151 = (fVar101 * local_228._4_4_ + fVar141 * local_268._4_4_) - fVar204;
      fVar152 = (fVar102 * (float)uStack_220 + fVar143 * (float)uStack_260) - fVar206;
      fVar153 = (fVar119 * uStack_220._4_4_ + fVar143 * uStack_260._4_4_) - fVar214;
      fVar100 = fVar84 * (fVar190 - fVar169) + fVar169;
      fVar101 = fVar84 * (fVar204 - fVar170) + fVar170;
      fVar102 = fVar84 * (fVar206 - fVar171) + fVar171;
      fVar119 = fVar84 * (fVar214 - fVar189) + fVar189;
      fVar191 = (fVar190 - fVar169) * fVar85 + fVar169;
      fVar205 = (fVar204 - fVar170) * fVar85 + fVar170;
      fVar213 = (fVar206 - fVar171) * fVar85 + fVar171;
      fVar215 = (fVar214 - fVar189) * fVar85 + fVar189;
      fVar221 = fVar84 * (fVar169 - fVar121) + fVar121;
      fVar223 = fVar84 * (fVar170 - fVar134) + fVar134;
      fVar226 = fVar84 * (fVar171 - fVar135) + fVar135;
      fVar231 = fVar84 * (fVar189 - fVar136) + fVar136;
      fVar221 = (fVar100 - fVar221) * fVar84 + fVar221;
      fVar223 = (fVar101 - fVar223) * fVar84 + fVar223;
      fVar226 = (fVar102 - fVar226) * fVar84 + fVar226;
      fVar231 = (fVar119 - fVar231) * fVar84 + fVar231;
      fVar100 = (((fVar84 * fVar142 + fVar190) - fVar100) * fVar84 + fVar100) - fVar221;
      fVar101 = (((fVar84 * fVar151 + fVar204) - fVar101) * fVar84 + fVar101) - fVar223;
      fVar102 = (((fVar84 * fVar152 + fVar206) - fVar102) * fVar84 + fVar102) - fVar226;
      fVar119 = (((fVar84 * fVar153 + fVar214) - fVar119) * fVar84 + fVar119) - fVar231;
      auVar80._0_4_ = fVar84 * fVar100 + fVar221;
      auVar80._4_4_ = fVar84 * fVar101 + fVar223;
      auVar80._8_4_ = fVar84 * fVar102 + fVar226;
      auVar80._12_4_ = fVar84 * fVar119 + fVar231;
      fVar121 = (fVar169 - fVar121) * fVar85 + fVar121;
      fVar134 = (fVar170 - fVar134) * fVar85 + fVar134;
      fVar135 = (fVar171 - fVar135) * fVar85 + fVar135;
      fVar136 = (fVar189 - fVar136) * fVar85 + fVar136;
      fVar121 = (fVar191 - fVar121) * fVar85 + fVar121;
      fVar134 = (fVar205 - fVar134) * fVar85 + fVar134;
      fVar135 = (fVar213 - fVar135) * fVar85 + fVar135;
      fVar136 = (fVar215 - fVar136) * fVar85 + fVar136;
      fVar169 = (((fVar142 * fVar85 + fVar190) - fVar191) * fVar85 + fVar191) - fVar121;
      fVar170 = (((fVar151 * fVar85 + fVar204) - fVar205) * fVar85 + fVar205) - fVar134;
      fVar171 = (((fVar152 * fVar85 + fVar206) - fVar213) * fVar85 + fVar213) - fVar135;
      fVar189 = (((fVar153 * fVar85 + fVar214) - fVar215) * fVar85 + fVar215) - fVar136;
      fVar121 = fVar85 * fVar169 + fVar121;
      fVar134 = fVar85 * fVar170 + fVar134;
      fVar135 = fVar85 * fVar171 + fVar135;
      fVar136 = fVar85 * fVar189 + fVar136;
      fVar190 = fVar120 * 0.33333334;
      fVar142 = fVar100 * 3.0 * fVar190 + auVar80._0_4_;
      fVar151 = fVar101 * 3.0 * fVar190 + auVar80._4_4_;
      fVar152 = fVar102 * 3.0 * fVar190 + auVar80._8_4_;
      fVar153 = fVar119 * 3.0 * fVar190 + auVar80._12_4_;
      fVar169 = fVar121 - fVar190 * fVar169 * 3.0;
      fVar170 = fVar134 - fVar190 * fVar170 * 3.0;
      fVar171 = fVar135 - fVar190 * fVar171 * 3.0;
      fVar189 = fVar136 - fVar190 * fVar189 * 3.0;
      auVar13._4_8_ = auVar259._8_8_;
      auVar13._0_4_ = auVar80._4_4_;
      auVar258._0_8_ = auVar13._0_8_ << 0x20;
      auVar258._8_4_ = auVar80._8_4_;
      auVar258._12_4_ = auVar80._12_4_;
      auVar259._8_8_ = auVar80._8_8_;
      auVar259._0_8_ = auVar258._8_8_;
      fVar205 = (fVar135 - fVar121) + (auVar80._8_4_ - auVar80._0_4_);
      fVar206 = (fVar136 - fVar134) + (auVar80._12_4_ - auVar80._4_4_);
      auVar196._0_4_ = fVar206 * fVar134;
      auVar196._4_4_ = fVar206 * fVar134;
      auVar196._8_4_ = fVar206 * fVar136;
      auVar196._12_4_ = fVar206 * fVar136;
      fVar100 = auVar80._0_4_ * fVar205 + auVar80._4_4_ * fVar206;
      fVar101 = auVar80._8_4_ * fVar205 + auVar80._12_4_ * fVar206;
      fVar213 = fVar142 * fVar205 + fVar151 * fVar206;
      fVar214 = fVar152 * fVar205 + fVar153 * fVar206;
      fVar190 = fVar169 * fVar205 + fVar170 * fVar206;
      auVar207._4_4_ = fVar170 * fVar205 + fVar170 * fVar206;
      auVar207._0_4_ = fVar190;
      fVar191 = fVar171 * fVar205 + fVar189 * fVar206;
      fVar102 = fVar205 * fVar121 + auVar196._0_4_;
      fVar204 = fVar205 * fVar135 + auVar196._8_4_;
      auVar14._4_8_ = auVar196._8_8_;
      auVar14._0_4_ = fVar151 * fVar205 + fVar151 * fVar206;
      auVar197._0_8_ = auVar14._0_8_ << 0x20;
      auVar197._8_4_ = fVar214;
      auVar197._12_4_ = fVar153 * fVar205 + fVar153 * fVar206;
      fVar119 = fVar213;
      if (fVar213 <= fVar100) {
        fVar119 = fVar100;
        fVar100 = fVar213;
      }
      auVar198._8_8_ = auVar197._8_8_;
      auVar198._0_8_ = auVar198._8_8_;
      auVar207._8_4_ = fVar191;
      auVar207._12_4_ = fVar189 * fVar205 + fVar189 * fVar206;
      if (fVar102 <= fVar190) {
        auVar207._0_4_ = fVar102;
      }
      if (auVar207._0_4_ <= fVar100) {
        fVar100 = auVar207._0_4_;
      }
      auVar15._4_8_ = auVar207._8_8_;
      auVar15._0_4_ = fVar205 * fVar134 + auVar196._4_4_;
      auVar208._0_8_ = auVar15._0_8_ << 0x20;
      auVar208._8_4_ = fVar204;
      auVar208._12_4_ = fVar205 * fVar136 + auVar196._12_4_;
      if (fVar102 <= fVar190) {
        fVar102 = fVar190;
      }
      auVar209._8_8_ = auVar208._8_8_;
      auVar209._0_8_ = auVar209._8_8_;
      if (fVar102 <= fVar119) {
        fVar102 = fVar119;
      }
      if (fVar214 <= fVar101) {
        auVar198._0_4_ = fVar101;
        fVar101 = fVar214;
      }
      fVar119 = fVar191;
      if (fVar204 <= fVar191) {
        fVar119 = fVar204;
      }
      if (fVar119 <= fVar101) {
        fVar101 = fVar119;
      }
      if (fVar204 <= fVar191) {
        auVar209._0_4_ = fVar191;
      }
      if (auVar209._0_4_ <= auVar198._0_4_) {
        auVar209._0_4_ = auVar198._0_4_;
      }
      uVar44 = CONCAT71((int7)(uVar44 >> 8),fVar120 < 0.001);
      bVar47 = 3 < (uint)uVar45;
      uVar16 = (undefined3)(uVar49 >> 8);
      uVar39 = (ulong)CONCAT31(uVar16,bVar47);
      fVar119 = auVar209._0_4_;
      if ((0.0001 <= fVar100) || (fVar119 <= -0.0001)) {
        if ((-0.0001 < fVar102 && fVar101 < 0.0001) ||
           ((fVar100 < 0.0001 && -0.0001 < fVar102 || (fVar101 < 0.0001 && -0.0001 < fVar119))))
        goto LAB_00b6ee51;
        bVar19 = true;
      }
      else {
LAB_00b6ee51:
        _local_378 = auVar259;
        local_418 = (Ray *)CONCAT44(fVar136,fVar135);
        bVar47 = bVar47 || fVar120 < 0.001;
        uVar39 = (ulong)CONCAT31(uVar16,bVar47);
        fVar204 = (float)(~-(uint)(fVar100 < 0.0) & 0x3f800000 | -(uint)(fVar100 < 0.0) & 0xbf800000
                         );
        fVar191 = (float)(~-(uint)(fVar102 < 0.0) & 0x3f800000 | -(uint)(fVar102 < 0.0) & 0xbf800000
                         );
        fVar190 = 0.0;
        if ((fVar204 == fVar191) && (!NAN(fVar204) && !NAN(fVar191))) {
          fVar190 = INFINITY;
        }
        fVar205 = 0.0;
        if ((fVar204 == fVar191) && (!NAN(fVar204) && !NAN(fVar191))) {
          fVar205 = -INFINITY;
        }
        fVar206 = (float)(~-(uint)(fVar101 < 0.0) & 0x3f800000 | -(uint)(fVar101 < 0.0) & 0xbf800000
                         );
        if ((fVar204 != fVar206) || (fVar213 = fVar205, NAN(fVar204) || NAN(fVar206))) {
          if ((fVar101 != fVar100) || (NAN(fVar101) || NAN(fVar100))) {
            fVar213 = -fVar100 / (fVar101 - fVar100);
            fVar213 = (1.0 - fVar213) * 0.0 + fVar213;
            fVar101 = fVar213;
          }
          else {
            fVar101 = INFINITY;
            if ((fVar100 == 0.0) && (fVar101 = INFINITY, !NAN(fVar100))) {
              fVar101 = 0.0;
            }
            fVar213 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar100 == 0.0) & 1) * 4);
          }
          if (fVar101 <= fVar190) {
            fVar190 = fVar101;
          }
          if (fVar213 <= fVar205) {
            fVar213 = fVar205;
          }
        }
        auVar259._0_12_ = ZEXT812(0);
        auVar259._12_4_ = 0.0;
        uVar44 = (ulong)(fVar119 < 0.0);
        fVar100 = *(float *)(&DAT_01ff1ecc + uVar44 * 4);
        if ((fVar191 != fVar100) || (fVar101 = fVar213, NAN(fVar191) || NAN(fVar100))) {
          if ((fVar119 != fVar102) || (NAN(fVar119) || NAN(fVar102))) {
            fVar101 = -fVar102 / (fVar119 - fVar102);
            fVar101 = (1.0 - fVar101) * 0.0 + fVar101;
            fVar119 = fVar101;
          }
          else {
            fVar119 = INFINITY;
            if ((fVar102 == 0.0) && (fVar119 = INFINITY, !NAN(fVar102))) {
              fVar119 = 0.0;
            }
            uVar44 = (ulong)(-(uint)(fVar102 == 0.0) & 1);
            fVar101 = *(float *)(&DAT_01ff1ec4 + uVar44 * 4);
          }
          if (fVar119 <= fVar190) {
            fVar190 = fVar119;
          }
          if (fVar101 <= fVar213) {
            fVar101 = fVar213;
          }
        }
        if ((fVar206 != fVar100) || (NAN(fVar206) || NAN(fVar100))) {
          fVar190 = (float)(~-(uint)(fVar190 < 1.0) & 0x3f800000 |
                           (uint)fVar190 & -(uint)(fVar190 < 1.0));
          fVar101 = (float)(~-(uint)(fVar101 < 1.0) & (uint)fVar101 |
                           -(uint)(fVar101 < 1.0) & 0x3f800000);
        }
        fVar190 = (float)(~-(uint)(fVar190 < 0.0) & (uint)fVar190);
        fVar100 = (float)(~-(uint)(fVar101 < 1.0) & 0x3f800000 |
                         (uint)fVar101 & -(uint)(fVar101 < 1.0));
        bVar19 = true;
        if (fVar190 <= fVar100) {
          fVar190 = fVar190 + -0.1;
          fVar100 = fVar100 + 0.1;
          uVar48 = -(uint)(fVar100 < 1.0);
          fVar190 = (float)(~-(uint)(fVar190 < 0.0) & (uint)fVar190);
          fVar215 = (float)(~uVar48 & 0x3f800000 | (uint)fVar100 & uVar48);
          fVar205 = 1.0 - fVar190;
          fVar206 = 1.0 - fVar190;
          fVar213 = 1.0 - fVar215;
          fVar214 = 1.0 - fVar215;
          fVar100 = auVar80._0_4_ * fVar205 + auVar80._8_4_ * fVar190;
          fVar101 = auVar80._4_4_ * fVar206 + auVar80._12_4_ * fVar190;
          fVar102 = auVar80._0_4_ * fVar213 + auVar80._8_4_ * fVar215;
          fVar119 = auVar80._4_4_ * fVar214 + auVar80._12_4_ * fVar215;
          fVar191 = fVar142 * fVar205 + fVar152 * fVar190;
          fVar204 = fVar151 * fVar206 + fVar153 * fVar190;
          fVar142 = fVar142 * fVar213 + fVar152 * fVar215;
          fVar151 = fVar151 * fVar214 + fVar153 * fVar215;
          fVar152 = fVar169 * fVar205 + fVar171 * fVar190;
          fVar153 = fVar170 * fVar206 + fVar189 * fVar190;
          fVar169 = fVar169 * fVar213 + fVar171 * fVar215;
          fVar170 = fVar170 * fVar214 + fVar189 * fVar215;
          fVar135 = fVar205 * fVar121 + fVar135 * fVar190;
          fVar136 = fVar206 * fVar134 + fVar136 * fVar190;
          fVar121 = fVar213 * fVar121 + fStack_420 * fVar215;
          fVar134 = fVar214 * fVar134 + fStack_41c * fVar215;
          fVar233 = fVar141 * (1.0 - fVar190) + fVar143 * fVar190;
          fStack_41c = fVar141 * (1.0 - fVar215) + fVar143 * fVar215;
          fVar120 = 1.0 / fVar120;
          auVar97._0_4_ = fVar121 - fVar135;
          auVar97._4_4_ = fVar134 - fVar136;
          auVar97._8_4_ = fVar121 - fVar121;
          auVar97._12_4_ = fVar134 - fVar134;
          auVar128._0_8_ = CONCAT44(fVar170 - fVar153,fVar169 - fVar152);
          auVar128._8_4_ = fVar169 - fVar169;
          auVar128._12_4_ = fVar170 - fVar170;
          auVar219._0_4_ = fVar142 - fVar191;
          auVar219._4_4_ = fVar151 - fVar204;
          auVar219._8_4_ = fVar142 - fVar142;
          auVar219._12_4_ = fVar151 - fVar151;
          auVar187._0_8_ = CONCAT44((fVar204 - fVar101) * 3.0,(fVar191 - fVar100) * 3.0);
          auVar187._8_4_ = (fVar142 - fVar102) * 3.0;
          auVar187._12_4_ = (fVar151 - fVar119) * 3.0;
          auVar147._0_8_ = CONCAT44((fVar153 - fVar204) * 3.0,(fVar152 - fVar191) * 3.0);
          auVar147._8_4_ = (fVar169 - fVar142) * 3.0;
          auVar147._12_4_ = (fVar170 - fVar151) * 3.0;
          auVar210._0_4_ = (fVar135 - fVar152) * 3.0;
          auVar210._4_4_ = (fVar136 - fVar153) * 3.0;
          auVar210._8_4_ = (fVar121 - fVar169) * 3.0;
          auVar210._12_4_ = (fVar134 - fVar170) * 3.0;
          auVar161._8_4_ = auVar147._8_4_;
          auVar161._0_8_ = auVar147._0_8_;
          auVar161._12_4_ = auVar147._12_4_;
          auVar194 = minps(auVar161,auVar210);
          auVar62 = maxps(auVar147,auVar210);
          auVar199._8_4_ = auVar187._8_4_;
          auVar199._0_8_ = auVar187._0_8_;
          auVar199._12_4_ = auVar187._12_4_;
          auVar106 = minps(auVar199,auVar194);
          auVar95 = maxps(auVar187,auVar62);
          auVar17._4_8_ = auVar62._8_8_;
          auVar17._0_4_ = auVar106._4_4_;
          auVar148._0_8_ = auVar17._0_8_ << 0x20;
          auVar148._8_4_ = auVar106._8_4_;
          auVar148._12_4_ = auVar106._12_4_;
          auVar149._8_8_ = auVar106._8_8_;
          auVar149._0_8_ = auVar148._8_8_;
          auVar18._4_8_ = auVar194._8_8_;
          auVar18._0_4_ = auVar95._4_4_;
          auVar162._0_8_ = auVar18._0_8_ << 0x20;
          auVar162._8_4_ = auVar95._8_4_;
          auVar162._12_4_ = auVar95._12_4_;
          auVar163._8_8_ = auVar95._8_8_;
          auVar163._0_8_ = auVar162._8_8_;
          auVar194 = minps(auVar106,auVar149);
          auVar62 = maxps(auVar95,auVar163);
          fVar205 = auVar194._0_4_ * fVar120;
          fVar206 = auVar194._4_4_ * fVar120;
          fVar213 = auVar194._8_4_ * fVar120;
          fVar214 = auVar194._12_4_ * fVar120;
          fVar151 = fVar120 * auVar62._0_4_;
          fVar152 = fVar120 * auVar62._4_4_;
          fVar169 = fVar120 * auVar62._8_4_;
          fVar120 = fVar120 * auVar62._12_4_;
          fVar191 = 1.0 / (fStack_41c - fVar233);
          auVar117._0_8_ = CONCAT44(fVar119 - fVar101,fVar102 - fVar100);
          auVar117._8_4_ = fVar102 - fVar102;
          auVar117._12_4_ = fVar119 - fVar119;
          auVar164._8_4_ = auVar117._8_4_;
          auVar164._0_8_ = auVar117._0_8_;
          auVar164._12_4_ = auVar117._12_4_;
          auVar95 = minps(auVar164,auVar219);
          auVar194 = maxps(auVar117,auVar219);
          auVar81._8_4_ = auVar128._8_4_;
          auVar81._0_8_ = auVar128._0_8_;
          auVar81._12_4_ = auVar128._12_4_;
          auVar62 = minps(auVar81,auVar97);
          auVar95 = minps(auVar95,auVar62);
          auVar62 = maxps(auVar128,auVar97);
          auVar62 = maxps(auVar194,auVar62);
          fVar189 = auVar95._0_4_ * fVar191;
          fVar190 = auVar95._4_4_ * fVar191;
          fVar204 = fVar191 * auVar62._0_4_;
          fVar191 = fVar191 * auVar62._4_4_;
          local_3f8 = CONCAT44(fStack_41c,fVar233);
          uStack_3f0 = CONCAT44(fVar141 * 0.0 + fVar143 * 0.0,fVar141 * 0.0 + fVar143 * 0.0);
          auVar150._4_4_ = fStack_41c;
          auVar150._0_4_ = fVar85;
          auVar150._8_4_ = fVar86;
          auVar150._12_4_ = fVar54;
          local_1cc = (fVar84 + fVar85) * 0.5;
          fVar100 = (fVar233 + fStack_41c) * 0.5;
          fVar101 = (fVar85 + fVar86) * 0.0;
          fVar102 = (fStack_41c + fVar54) * 0.0;
          fVar119 = local_88 * local_1cc + (float)local_308;
          fVar121 = fStack_84 * local_1cc + local_308._4_4_;
          fVar134 = fStack_80 * local_1cc + (float)uStack_300;
          fVar135 = fStack_7c * local_1cc + uStack_300._4_4_;
          fVar136 = local_98 * local_1cc + (float)local_318._0_4_;
          fVar141 = fStack_94 * local_1cc + (float)local_318._4_4_;
          fVar142 = fStack_90 * local_1cc + fStack_310;
          fVar143 = fStack_8c * local_1cc + fStack_30c;
          fVar119 = (fVar136 - fVar119) * local_1cc + fVar119;
          fVar121 = (fVar141 - fVar121) * local_1cc + fVar121;
          fVar134 = (fVar142 - fVar134) * local_1cc + fVar134;
          fVar135 = (fVar143 - fVar135) * local_1cc + fVar135;
          fVar136 = (((local_a8 * local_1cc + (float)local_328) - fVar136) * local_1cc + fVar136) -
                    fVar119;
          fVar141 = (((fStack_a4 * local_1cc + local_328._4_4_) - fVar141) * local_1cc + fVar141) -
                    fVar121;
          fVar142 = (((fStack_a0 * local_1cc + (float)uStack_320) - fVar142) * local_1cc + fVar142)
                    - fVar134;
          fVar143 = (((fStack_9c * local_1cc + uStack_320._4_4_) - fVar143) * local_1cc + fVar143) -
                    fVar135;
          fVar119 = local_1cc * fVar136 + fVar119;
          fVar121 = local_1cc * fVar141 + fVar121;
          fVar136 = fVar136 * 3.0;
          fVar141 = fVar141 * 3.0;
          fVar134 = (local_1cc * fVar142 + fVar134) - fVar119;
          fVar135 = (local_1cc * fVar143 + fVar135) - fVar121;
          fVar136 = (fVar142 * 3.0 - fVar136) * fVar100 + fVar136;
          fVar141 = (fVar143 * 3.0 - fVar141) * fVar100 + fVar141;
          auVar98._0_8_ = CONCAT44(fVar136,fVar134) ^ 0x80000000;
          auVar98._8_4_ = fVar136;
          auVar98._12_4_ = fVar136;
          fVar215 = fVar84 - local_1cc;
          fVar221 = fVar233 - fVar100;
          fVar223 = fVar85 - fVar101;
          fVar226 = fStack_41c - fVar102;
          fVar231 = fVar85 - local_1cc;
          fVar232 = fStack_41c - fVar100;
          fVar86 = fVar86 - fVar101;
          fVar54 = fVar54 - fVar102;
          fVar119 = fVar134 * fVar100 + fVar119;
          fVar121 = fVar135 * fVar100 + fVar121;
          auVar118._0_8_ = CONCAT44(fVar141,fVar135) ^ 0x8000000000000000;
          auVar118._8_4_ = -fVar141;
          auVar118._12_4_ = -fVar141;
          auVar237._0_4_ = fVar135 * fVar136 - fVar141 * fVar134;
          auVar237._4_4_ = auVar237._0_4_;
          auVar237._8_4_ = auVar237._0_4_;
          auVar237._12_4_ = auVar237._0_4_;
          auVar194 = divps(auVar118,auVar237);
          auVar62 = divps(auVar98,auVar237);
          fVar135 = auVar194._0_4_;
          fVar136 = auVar194._4_4_;
          fVar102 = auVar62._0_4_;
          fVar134 = auVar62._4_4_;
          local_1cc = local_1cc - (fVar121 * fVar102 + fVar119 * fVar135);
          fStack_1c8 = fVar100 - (fVar121 * fVar134 + fVar119 * fVar136);
          fVar101 = fVar100 - (fVar121 * auVar62._8_4_ + fVar119 * auVar194._8_4_);
          fVar100 = fVar100 - (fVar121 * auVar62._12_4_ + fVar119 * auVar194._12_4_);
          auVar254._0_8_ = CONCAT44(fVar136 * fVar189,fVar136 * fVar205);
          auVar254._8_4_ = fVar136 * fVar206;
          auVar254._12_4_ = fVar136 * fVar190;
          auVar211._0_4_ = fVar136 * fVar151;
          auVar211._4_4_ = fVar136 * fVar204;
          auVar211._8_4_ = fVar136 * fVar152;
          auVar211._12_4_ = fVar136 * fVar191;
          auVar260._8_4_ = auVar254._8_4_;
          auVar260._0_8_ = auVar254._0_8_;
          auVar260._12_4_ = auVar254._12_4_;
          auVar106 = minps(auVar260,auVar211);
          auVar194 = maxps(auVar211,auVar254);
          auVar129._0_8_ = CONCAT44(fVar134 * fVar190,fVar134 * fVar206);
          auVar129._8_4_ = fVar134 * fVar213;
          auVar129._12_4_ = fVar134 * fVar214;
          auVar255._0_4_ = fVar134 * fVar152;
          auVar255._4_4_ = fVar134 * fVar191;
          auVar255._8_4_ = fVar134 * fVar169;
          auVar255._12_4_ = fVar134 * fVar120;
          auVar200._8_4_ = auVar129._8_4_;
          auVar200._0_8_ = auVar129._0_8_;
          auVar200._12_4_ = auVar129._12_4_;
          auVar62 = minps(auVar200,auVar255);
          auVar95 = maxps(auVar255,auVar129);
          fVar119 = 0.0 - (auVar95._0_4_ + auVar194._0_4_);
          fVar121 = 1.0 - (auVar95._4_4_ + auVar194._4_4_);
          fVar141 = 0.0 - (auVar95._8_4_ + auVar194._8_4_);
          fVar142 = 0.0 - (auVar95._12_4_ + auVar194._12_4_);
          fVar143 = 0.0 - (auVar62._0_4_ + auVar106._0_4_);
          fVar153 = 1.0 - (auVar62._4_4_ + auVar106._4_4_);
          fVar170 = 0.0 - (auVar62._8_4_ + auVar106._8_4_);
          fVar171 = 0.0 - (auVar62._12_4_ + auVar106._12_4_);
          auVar212._0_8_ = CONCAT44(fVar221 * fVar121,fVar215 * fVar119);
          auVar212._8_4_ = fVar223 * fVar141;
          auVar212._12_4_ = fVar226 * fVar142;
          auVar238._0_8_ = CONCAT44(fVar189 * fVar135,fVar205 * fVar135);
          auVar238._8_4_ = fVar206 * fVar135;
          auVar238._12_4_ = fVar190 * fVar135;
          auVar201._0_4_ = fVar135 * fVar151;
          auVar201._4_4_ = fVar135 * fVar204;
          auVar201._8_4_ = fVar135 * fVar152;
          auVar201._12_4_ = fVar135 * fVar191;
          auVar248._8_4_ = auVar238._8_4_;
          auVar248._0_8_ = auVar238._0_8_;
          auVar248._12_4_ = auVar238._12_4_;
          auVar194 = minps(auVar248,auVar201);
          auVar62 = maxps(auVar201,auVar238);
          auVar165._0_8_ = CONCAT44(fVar190 * fVar102,fVar206 * fVar102);
          auVar165._8_4_ = fVar213 * fVar102;
          auVar165._12_4_ = fVar214 * fVar102;
          auVar256._0_4_ = fVar102 * fVar152;
          auVar256._4_4_ = fVar102 * fVar191;
          auVar256._8_4_ = fVar102 * fVar169;
          auVar256._12_4_ = fVar102 * fVar120;
          auVar261._8_4_ = auVar165._8_4_;
          auVar261._0_8_ = auVar165._0_8_;
          auVar261._12_4_ = auVar165._12_4_;
          auVar95 = minps(auVar261,auVar256);
          auVar259._0_4_ = auVar95._0_4_ + auVar194._0_4_;
          auVar259._4_4_ = auVar95._4_4_ + auVar194._4_4_;
          auVar259._8_4_ = auVar95._8_4_ + auVar194._8_4_;
          auVar259._12_4_ = auVar95._12_4_ + auVar194._12_4_;
          auVar239._0_4_ = fVar215 * fVar143;
          auVar239._4_4_ = fVar221 * fVar153;
          auVar239._8_4_ = fVar223 * fVar170;
          auVar239._12_4_ = fVar226 * fVar171;
          auVar130._0_8_ = CONCAT44(fVar121 * fVar232,fVar119 * fVar231);
          auVar130._8_4_ = fVar141 * fVar86;
          auVar130._12_4_ = fVar142 * fVar54;
          auVar140._0_4_ = fVar143 * fVar231;
          auVar140._4_4_ = fVar153 * fVar232;
          auVar140._8_4_ = fVar170 * fVar86;
          auVar140._12_4_ = fVar171 * fVar54;
          auVar194 = maxps(auVar256,auVar165);
          fVar120 = 1.0 - (auVar194._0_4_ + auVar62._0_4_);
          fVar119 = 0.0 - (auVar194._4_4_ + auVar62._4_4_);
          fVar121 = 0.0 - (auVar194._8_4_ + auVar62._8_4_);
          fVar141 = 0.0 - (auVar194._12_4_ + auVar62._12_4_);
          auVar202._0_8_ = CONCAT44(fVar221 * fVar119,fVar215 * fVar120);
          auVar202._8_4_ = fVar223 * fVar121;
          auVar202._12_4_ = fVar226 * fVar141;
          auVar220._0_4_ = fVar215 * (1.0 - auVar259._0_4_);
          auVar220._4_4_ = fVar221 * (0.0 - auVar259._4_4_);
          auVar220._8_4_ = fVar223 * (0.0 - auVar259._8_4_);
          auVar220._12_4_ = fVar226 * (0.0 - auVar259._12_4_);
          auVar166._0_8_ = CONCAT44(fVar119 * fVar232,fVar120 * fVar231);
          auVar166._8_4_ = fVar121 * fVar86;
          auVar166._12_4_ = fVar141 * fVar54;
          auVar188._0_4_ = (1.0 - auVar259._0_4_) * fVar231;
          auVar188._4_4_ = (0.0 - auVar259._4_4_) * fVar232;
          auVar188._8_4_ = (0.0 - auVar259._8_4_) * fVar86;
          auVar188._12_4_ = (0.0 - auVar259._12_4_) * fVar54;
          auVar230._8_4_ = auVar202._8_4_;
          auVar230._0_8_ = auVar202._0_8_;
          auVar230._12_4_ = auVar202._12_4_;
          auVar62 = minps(auVar230,auVar220);
          auVar249._8_4_ = auVar166._8_4_;
          auVar249._0_8_ = auVar166._0_8_;
          auVar249._12_4_ = auVar166._12_4_;
          auVar194 = minps(auVar249,auVar188);
          auVar106 = minps(auVar62,auVar194);
          auVar194 = maxps(auVar220,auVar202);
          auVar62 = maxps(auVar188,auVar166);
          auVar95 = maxps(auVar62,auVar194);
          auVar167._8_4_ = auVar212._8_4_;
          auVar167._0_8_ = auVar212._0_8_;
          auVar167._12_4_ = auVar212._12_4_;
          auVar62 = minps(auVar167,auVar239);
          auVar203._8_4_ = auVar130._8_4_;
          auVar203._0_8_ = auVar130._0_8_;
          auVar203._12_4_ = auVar130._12_4_;
          auVar194 = minps(auVar203,auVar140);
          auVar194 = minps(auVar62,auVar194);
          auVar253 = maxps(auVar239,auVar212);
          auVar62 = maxps(auVar140,auVar130);
          auVar62 = maxps(auVar62,auVar253);
          auVar168._0_4_ = auVar106._4_4_ + auVar106._0_4_ + local_1cc;
          auVar168._4_4_ = auVar194._4_4_ + auVar194._0_4_ + fStack_1c8;
          auVar168._8_4_ = auVar106._8_4_ + auVar106._4_4_ + fVar101;
          auVar168._12_4_ = auVar106._12_4_ + auVar194._4_4_ + fVar100;
          fVar120 = auVar95._4_4_ + auVar95._0_4_ + local_1cc;
          fVar54 = auVar62._4_4_ + auVar62._0_4_ + fStack_1c8;
          auVar131._4_4_ = fVar54;
          auVar131._0_4_ = fVar120;
          auVar21._4_4_ = fVar233;
          auVar21._0_4_ = fVar84;
          auVar21._8_4_ = fVar85;
          auVar21._12_4_ = fStack_41c;
          auVar194 = maxps(auVar21,auVar168);
          auVar131._8_4_ = auVar95._8_4_ + auVar95._4_4_ + fVar101;
          auVar131._12_4_ = auVar95._12_4_ + auVar62._4_4_ + fVar100;
          auVar62 = minps(auVar131,auVar150);
          iVar42 = -(uint)(auVar62._0_4_ < auVar194._0_4_);
          iVar50 = -(uint)(auVar62._4_4_ < auVar194._4_4_);
          auVar133._4_4_ = iVar50;
          auVar133._0_4_ = iVar42;
          auVar133._8_4_ = iVar50;
          auVar133._12_4_ = iVar50;
          auVar132._8_8_ = auVar133._8_8_;
          auVar132._4_4_ = iVar42;
          auVar132._0_4_ = iVar42;
          uVar48 = movmskpd((int)uVar44,auVar132);
          uVar44 = (ulong)uVar48;
          fStack_420 = fVar85;
          if (uVar48 == 0) {
            uVar44 = 0;
            if (auVar168._0_4_ <= fVar84) {
              auVar259._0_12_ = ZEXT812(0x40400000);
              auVar259._12_4_ = 0.0;
            }
            else {
              auVar259._0_12_ = ZEXT812(0x40400000);
              auVar259._12_4_ = 0.0;
              if (fVar120 < fVar85) {
                iVar42 = -(uint)(fVar54 < fStack_41c);
                uVar44 = (ulong)CONCAT11((char)((uint)iVar42 >> 8),
                                         (byte)iVar42 & fVar233 < auVar168._4_4_);
              }
            }
            bVar38 = bVar47 | (byte)uVar44;
            uVar39 = (ulong)CONCAT31(uVar16,bVar38);
            if (bVar38 == 1) {
              uVar39 = 200;
              do {
                fVar54 = 1.0 - local_1cc;
                fVar86 = local_1cc * local_1cc * local_1cc;
                fVar101 = auVar259._0_4_;
                fVar85 = local_1cc * local_1cc * fVar101 * fVar54;
                fVar120 = fVar54 * fVar54 * fVar54;
                fVar100 = local_1cc * fVar101 * fVar54 * fVar54;
                fVar54 = fVar120 * (float)local_308 +
                         fVar100 * (float)local_318._0_4_ +
                         fVar85 * (float)local_328 + fVar86 * (float)local_3d8._0_4_;
                fVar84 = fVar120 * local_308._4_4_ +
                         fVar100 * (float)local_318._4_4_ +
                         fVar85 * local_328._4_4_ + fVar86 * (float)local_3d8._4_4_;
                fVar54 = ((fVar120 * (float)uStack_300 +
                          fVar100 * fStack_310 + fVar85 * (float)uStack_320 + fVar86 * fStack_3d0) -
                         fVar54) * fStack_1c8 + fVar54;
                fVar84 = ((fVar120 * uStack_300._4_4_ +
                          fVar100 * fStack_30c + fVar85 * uStack_320._4_4_ + fVar86 * fStack_3cc) -
                         fVar84) * fStack_1c8 + fVar84;
                local_1cc = local_1cc - (fVar84 * fVar102 + fVar54 * fVar135);
                fStack_1c8 = fStack_1c8 - (fVar84 * fVar134 + fVar54 * fVar136);
                fVar120 = ABS(fVar84);
                if (ABS(fVar84) <= ABS(fVar54)) {
                  fVar120 = ABS(fVar54);
                }
                if (fVar120 < local_2f8) {
                  if ((((0.0 <= local_1cc) && (local_1cc <= 1.0)) && (0.0 <= fStack_1c8)) &&
                     (fStack_1c8 <= 1.0)) {
                    fVar120 = (pre->ray_space).vx.field_0.m128[2];
                    fVar54 = (pre->ray_space).vy.field_0.m128[2];
                    fVar84 = (pre->ray_space).vz.field_0.m128[2];
                    fVar85 = (pRVar46->org).field_0.m128[0];
                    fVar86 = (pRVar46->org).field_0.m128[1];
                    fVar100 = (pRVar46->org).field_0.m128[2];
                    fVar135 = 1.0 - fStack_1c8;
                    fVar134 = 1.0 - local_1cc;
                    fVar102 = fVar134 * fVar134 * fVar134;
                    fVar119 = local_1cc * fVar101 * fVar134 * fVar134;
                    fVar121 = local_1cc * local_1cc * local_1cc;
                    fVar101 = local_1cc * local_1cc * fVar101 * fVar134;
                    fVar120 = (((fStack_330 - fVar100) * fVar84 +
                               (fStack_334 - fVar86) * fVar54 + (local_338 - fVar85) * fVar120) *
                               fVar135 +
                              ((fStack_380 - fVar100) * fVar84 +
                              (fStack_384 - fVar86) * fVar54 + (local_388 - fVar85) * fVar120) *
                              fStack_1c8) * fVar102 +
                              (((fStack_340 - fVar100) * fVar84 +
                               (fStack_344 - fVar86) * fVar54 + (local_348 - fVar85) * fVar120) *
                               fVar135 +
                              ((fStack_2a0 - fVar100) * fVar84 +
                              (fStack_2a4 - fVar86) * fVar54 + (local_2a8 - fVar85) * fVar120) *
                              fStack_1c8) * fVar119 +
                              (((fStack_360 - fVar100) * fVar84 +
                               (fStack_364 - fVar86) * fVar54 + (local_368 - fVar85) * fVar120) *
                               fVar135 +
                              ((fStack_3a0 - fVar100) * fVar84 +
                              (fStack_3a4 - fVar86) * fVar54 + (local_3a8 - fVar85) * fVar120) *
                              fStack_1c8) * fVar101 +
                              (fVar135 * ((fStack_350 - fVar100) * fVar84 +
                                         (fStack_354 - fVar86) * fVar54 +
                                         (local_358 - fVar85) * fVar120) +
                              ((fStack_390 - fVar100) * fVar84 +
                              (fStack_394 - fVar86) * fVar54 + (local_398 - fVar85) * fVar120) *
                              fStack_1c8) * fVar121;
                    if (((pRVar46->org).field_0.m128[3] <= fVar120) &&
                       (fVar54 = pRVar46->tfar, fVar120 <= fVar54)) {
                      fVar100 = 1.0 - fStack_1c8;
                      fVar135 = 1.0 - fStack_1c8;
                      fVar136 = 1.0 - fStack_1c8;
                      fVar84 = local_348 * fVar100 + local_2a8 * fStack_1c8;
                      fVar85 = fStack_344 * fVar135 + fStack_2a4 * fStack_1c8;
                      fVar86 = fStack_340 * fVar136 + fStack_2a0 * fStack_1c8;
                      fVar141 = local_368 * fVar100 + local_3a8 * fStack_1c8;
                      fVar143 = fStack_364 * fVar135 + fStack_3a4 * fStack_1c8;
                      fVar152 = fStack_360 * fVar136 + fStack_3a0 * fStack_1c8;
                      fVar142 = fVar141 - fVar84;
                      fVar151 = fVar143 - fVar85;
                      fVar153 = fVar152 - fVar86;
                      fVar84 = (((fVar84 - (local_338 * fVar100 + local_388 * fStack_1c8)) * fVar134
                                + local_1cc * fVar142) * fVar134 +
                               (fVar142 * fVar134 +
                               ((fVar100 * local_358 + fStack_1c8 * local_398) - fVar141) *
                               local_1cc) * local_1cc) * 3.0;
                      fVar85 = (((fVar85 - (fStack_334 * fVar135 + fStack_384 * fStack_1c8)) *
                                 fVar134 + local_1cc * fVar151) * fVar134 +
                               (fVar151 * fVar134 +
                               ((fVar135 * fStack_354 + fStack_1c8 * fStack_394) - fVar143) *
                               local_1cc) * local_1cc) * 3.0;
                      fVar86 = (((fVar86 - (fStack_330 * fVar136 + fStack_380 * fStack_1c8)) *
                                 fVar134 + local_1cc * fVar153) * fVar134 +
                               (fVar153 * fVar134 +
                               ((fVar136 * fStack_350 + fStack_1c8 * fStack_390) - fVar152) *
                               local_1cc) * local_1cc) * 3.0;
                      pGVar5 = (context->scene->geometries).items[local_3c0].ptr;
                      if ((pGVar5->mask & pRVar46->mask) == 0) {
                        uVar39 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar39 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar100 = fVar102 * local_178 +
                                  fVar119 * local_188 + fVar101 * local_198 + fVar121 * local_1a8;
                        fVar134 = fVar102 * fStack_174 +
                                  fVar119 * fStack_184 + fVar101 * fStack_194 + fVar121 * fStack_1a4
                        ;
                        fVar101 = fVar102 * fStack_170 +
                                  fVar119 * fStack_180 + fVar101 * fStack_190 + fVar121 * fStack_1a0
                        ;
                        local_1d8 = CONCAT44(fVar100 * fVar86 - fVar84 * fVar101,
                                             fVar101 * fVar85 - fVar86 * fVar134);
                        local_1d0 = fVar134 * fVar84 - fVar85 * fVar100;
                        local_1c4 = (int)local_2e8;
                        local_1c0 = (int)local_3c0;
                        local_1bc = context->user->instID[0];
                        local_1b8 = context->user->instPrimID[0];
                        local_418->tfar = fVar120;
                        local_3fc = 0xffffffff;
                        local_2d8.valid = &local_3fc;
                        local_2d8.geometryUserPtr = pGVar5->userPtr;
                        local_2d8.context = context->user;
                        local_2d8.ray = (RTCRayN *)local_418;
                        local_2d8.hit = (RTCHitN *)&local_1d8;
                        local_2d8.N = 1;
                        if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar5->occlusionFilterN)(&local_2d8), *local_2d8.valid != 0)) {
                          p_Var41 = context->args->filter;
                          if (p_Var41 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var41)(&local_2d8);
                            }
                            p_Var41 = (RTCFilterFunctionN)local_2d8.valid;
                            if (*local_2d8.valid == 0) goto LAB_00b6fb72;
                          }
                          uVar39 = CONCAT71((int7)((ulong)p_Var41 >> 8),1);
                        }
                        else {
LAB_00b6fb72:
                          uVar39 = 0;
                        }
                        if ((char)uVar39 == '\0') {
                          local_418->tfar = fVar54;
                        }
                      }
                      local_42c = (uint)(byte)((byte)local_42c | (byte)uVar39);
                      uVar44 = (ulong)local_42c;
                      pRVar46 = local_418;
                    }
                  }
                  break;
                }
                uVar39 = uVar39 - 1;
              } while (uVar39 != 0);
            }
            else {
              bVar19 = false;
            }
          }
        }
      }
    } while (bVar19);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }